

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx512::CurveNvIntersectorK<8,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  long lVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  byte bVar66;
  ulong uVar67;
  ulong uVar68;
  uint uVar69;
  ulong uVar70;
  ulong uVar71;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  long lVar72;
  byte bVar73;
  float fVar74;
  float fVar75;
  float fVar123;
  float fVar124;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar81 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar82 [16];
  float fVar125;
  float fVar127;
  float fVar128;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar126;
  float fVar129;
  float fVar130;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  float fVar131;
  undefined4 uVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  float fVar139;
  float fVar140;
  undefined1 auVar138 [64];
  undefined8 uVar141;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar146;
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar160;
  float fVar162;
  undefined1 auVar161 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  vint<16> mask;
  float old_t_1;
  RTCFilterFunctionNArguments local_8f0;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_730 [8];
  float fStack_728;
  float fStack_724;
  undefined8 local_720;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [64];
  uint local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 uStack_688;
  undefined4 uStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined4 local_600;
  int local_5fc;
  undefined1 local_5f0 [16];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  float local_5a0 [4];
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar174 [64];
  
  PVar10 = prim[1];
  uVar67 = (ulong)(byte)PVar10;
  lVar63 = uVar67 * 0x19;
  fVar147 = *(float *)(prim + lVar63 + 0x12);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar79 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar81 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + lVar63 + 6));
  fVar146 = fVar147 * auVar81._0_4_;
  fVar131 = fVar147 * auVar79._0_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar67 * 4 + 6);
  auVar89 = vpmovsxbd_avx2(auVar20);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar67 * 5 + 6);
  auVar86 = vpmovsxbd_avx2(auVar78);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar67 * 6 + 6);
  auVar87 = vpmovsxbd_avx2(auVar80);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar67 * 0xb + 6);
  auVar88 = vpmovsxbd_avx2(auVar77);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6);
  auVar93 = vpmovsxbd_avx2(auVar76);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar91 = vcvtdq2ps_avx(auVar93);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar10 * 0xc + uVar67 + 6);
  auVar90 = vpmovsxbd_avx2(auVar6);
  auVar90 = vcvtdq2ps_avx(auVar90);
  uVar70 = (ulong)(uint)((int)(uVar67 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar70 + 6);
  auVar99 = vpmovsxbd_avx2(auVar7);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar70 + uVar67 + 6);
  auVar98 = vpmovsxbd_avx2(auVar8);
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar68 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar85 = vpmovsxbd_avx2(auVar9);
  auVar92 = vcvtdq2ps_avx(auVar85);
  auVar170._4_4_ = fVar131;
  auVar170._0_4_ = fVar131;
  auVar170._8_4_ = fVar131;
  auVar170._12_4_ = fVar131;
  auVar170._16_4_ = fVar131;
  auVar170._20_4_ = fVar131;
  auVar170._24_4_ = fVar131;
  auVar170._28_4_ = fVar131;
  auVar175._8_4_ = 1;
  auVar175._0_8_ = 0x100000001;
  auVar175._12_4_ = 1;
  auVar175._16_4_ = 1;
  auVar175._20_4_ = 1;
  auVar175._24_4_ = 1;
  auVar175._28_4_ = 1;
  auVar83 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar95 = ZEXT1632(CONCAT412(fVar147 * auVar79._12_4_,
                               CONCAT48(fVar147 * auVar79._8_4_,
                                        CONCAT44(fVar147 * auVar79._4_4_,fVar131))));
  auVar94 = vpermps_avx2(auVar175,auVar95);
  auVar84 = vpermps_avx512vl(auVar83,auVar95);
  fVar131 = auVar84._0_4_;
  fVar139 = auVar84._4_4_;
  auVar95._4_4_ = fVar139 * auVar87._4_4_;
  auVar95._0_4_ = fVar131 * auVar87._0_4_;
  fVar140 = auVar84._8_4_;
  auVar95._8_4_ = fVar140 * auVar87._8_4_;
  fVar160 = auVar84._12_4_;
  auVar95._12_4_ = fVar160 * auVar87._12_4_;
  fVar162 = auVar84._16_4_;
  auVar95._16_4_ = fVar162 * auVar87._16_4_;
  fVar74 = auVar84._20_4_;
  auVar95._20_4_ = fVar74 * auVar87._20_4_;
  fVar75 = auVar84._24_4_;
  auVar95._24_4_ = fVar75 * auVar87._24_4_;
  auVar95._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar90._4_4_ * fVar139;
  auVar93._0_4_ = auVar90._0_4_ * fVar131;
  auVar93._8_4_ = auVar90._8_4_ * fVar140;
  auVar93._12_4_ = auVar90._12_4_ * fVar160;
  auVar93._16_4_ = auVar90._16_4_ * fVar162;
  auVar93._20_4_ = auVar90._20_4_ * fVar74;
  auVar93._24_4_ = auVar90._24_4_ * fVar75;
  auVar93._28_4_ = auVar85._28_4_;
  auVar85._4_4_ = auVar92._4_4_ * fVar139;
  auVar85._0_4_ = auVar92._0_4_ * fVar131;
  auVar85._8_4_ = auVar92._8_4_ * fVar140;
  auVar85._12_4_ = auVar92._12_4_ * fVar160;
  auVar85._16_4_ = auVar92._16_4_ * fVar162;
  auVar85._20_4_ = auVar92._20_4_ * fVar74;
  auVar85._24_4_ = auVar92._24_4_ * fVar75;
  auVar85._28_4_ = auVar84._28_4_;
  auVar20 = vfmadd231ps_fma(auVar95,auVar94,auVar86);
  auVar78 = vfmadd231ps_fma(auVar93,auVar94,auVar91);
  auVar80 = vfmadd231ps_fma(auVar85,auVar98,auVar94);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar170,auVar89);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar170,auVar88);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar99,auVar170);
  auVar171._4_4_ = fVar146;
  auVar171._0_4_ = fVar146;
  auVar171._8_4_ = fVar146;
  auVar171._12_4_ = fVar146;
  auVar171._16_4_ = fVar146;
  auVar171._20_4_ = fVar146;
  auVar171._24_4_ = fVar146;
  auVar171._28_4_ = fVar146;
  auVar85 = ZEXT1632(CONCAT412(fVar147 * auVar81._12_4_,
                               CONCAT48(fVar147 * auVar81._8_4_,
                                        CONCAT44(fVar147 * auVar81._4_4_,fVar146))));
  auVar93 = vpermps_avx2(auVar175,auVar85);
  auVar85 = vpermps_avx512vl(auVar83,auVar85);
  fVar147 = auVar85._0_4_;
  fVar131 = auVar85._4_4_;
  auVar94._4_4_ = fVar131 * auVar87._4_4_;
  auVar94._0_4_ = fVar147 * auVar87._0_4_;
  fVar139 = auVar85._8_4_;
  auVar94._8_4_ = fVar139 * auVar87._8_4_;
  fVar140 = auVar85._12_4_;
  auVar94._12_4_ = fVar140 * auVar87._12_4_;
  fVar160 = auVar85._16_4_;
  auVar94._16_4_ = fVar160 * auVar87._16_4_;
  fVar162 = auVar85._20_4_;
  auVar94._20_4_ = fVar162 * auVar87._20_4_;
  fVar74 = auVar85._24_4_;
  auVar94._24_4_ = fVar74 * auVar87._24_4_;
  auVar94._28_4_ = 1;
  auVar83._4_4_ = auVar90._4_4_ * fVar131;
  auVar83._0_4_ = auVar90._0_4_ * fVar147;
  auVar83._8_4_ = auVar90._8_4_ * fVar139;
  auVar83._12_4_ = auVar90._12_4_ * fVar140;
  auVar83._16_4_ = auVar90._16_4_ * fVar160;
  auVar83._20_4_ = auVar90._20_4_ * fVar162;
  auVar83._24_4_ = auVar90._24_4_ * fVar74;
  auVar83._28_4_ = auVar87._28_4_;
  auVar90._4_4_ = auVar92._4_4_ * fVar131;
  auVar90._0_4_ = auVar92._0_4_ * fVar147;
  auVar90._8_4_ = auVar92._8_4_ * fVar139;
  auVar90._12_4_ = auVar92._12_4_ * fVar140;
  auVar90._16_4_ = auVar92._16_4_ * fVar160;
  auVar90._20_4_ = auVar92._20_4_ * fVar162;
  auVar90._24_4_ = auVar92._24_4_ * fVar74;
  auVar90._28_4_ = auVar85._28_4_;
  auVar77 = vfmadd231ps_fma(auVar94,auVar93,auVar86);
  auVar76 = vfmadd231ps_fma(auVar83,auVar93,auVar91);
  auVar6 = vfmadd231ps_fma(auVar90,auVar93,auVar98);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar171,auVar89);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar171,auVar88);
  auVar163._8_4_ = 0x7fffffff;
  auVar163._0_8_ = 0x7fffffff7fffffff;
  auVar163._12_4_ = 0x7fffffff;
  auVar163._16_4_ = 0x7fffffff;
  auVar163._20_4_ = 0x7fffffff;
  auVar163._24_4_ = 0x7fffffff;
  auVar163._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar171,auVar99);
  auVar89 = vandps_avx(ZEXT1632(auVar20),auVar163);
  auVar161._8_4_ = 0x219392ef;
  auVar161._0_8_ = 0x219392ef219392ef;
  auVar161._12_4_ = 0x219392ef;
  auVar161._16_4_ = 0x219392ef;
  auVar161._20_4_ = 0x219392ef;
  auVar161._24_4_ = 0x219392ef;
  auVar161._28_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar89,auVar161,1);
  bVar14 = (bool)((byte)uVar70 & 1);
  auVar84._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar20._0_4_;
  bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar20._4_4_;
  bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar20._8_4_;
  bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar20._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  auVar89 = vandps_avx(ZEXT1632(auVar78),auVar163);
  uVar70 = vcmpps_avx512vl(auVar89,auVar161,1);
  bVar14 = (bool)((byte)uVar70 & 1);
  auVar96._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar78._0_4_;
  bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar78._4_4_;
  bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar78._8_4_;
  bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar78._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  auVar89 = vandps_avx(ZEXT1632(auVar80),auVar163);
  uVar70 = vcmpps_avx512vl(auVar89,auVar161,1);
  bVar14 = (bool)((byte)uVar70 & 1);
  auVar89._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar80._0_4_;
  bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar80._4_4_;
  bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar80._8_4_;
  bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar80._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  auVar86 = vrcp14ps_avx512vl(auVar84);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar88 = vfnmadd213ps_avx512vl(auVar84,auVar86,auVar87);
  auVar20 = vfmadd132ps_fma(auVar88,auVar86,auVar86);
  auVar86 = vrcp14ps_avx512vl(auVar96);
  auVar88 = vfnmadd213ps_avx512vl(auVar96,auVar86,auVar87);
  auVar78 = vfmadd132ps_fma(auVar88,auVar86,auVar86);
  auVar86 = vrcp14ps_avx512vl(auVar89);
  auVar89 = vfnmadd213ps_avx512vl(auVar89,auVar86,auVar87);
  auVar80 = vfmadd132ps_fma(auVar89,auVar86,auVar86);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 7 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar77));
  auVar99._4_4_ = auVar20._4_4_ * auVar89._4_4_;
  auVar99._0_4_ = auVar20._0_4_ * auVar89._0_4_;
  auVar99._8_4_ = auVar20._8_4_ * auVar89._8_4_;
  auVar99._12_4_ = auVar20._12_4_ * auVar89._12_4_;
  auVar99._16_4_ = auVar89._16_4_ * 0.0;
  auVar99._20_4_ = auVar89._20_4_ * 0.0;
  auVar99._24_4_ = auVar89._24_4_ * 0.0;
  auVar99._28_4_ = auVar89._28_4_;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 9 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar77));
  auVar90 = vpbroadcastd_avx512vl();
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar10 * 0x10 + 6));
  auVar144._0_4_ = auVar20._0_4_ * auVar89._0_4_;
  auVar144._4_4_ = auVar20._4_4_ * auVar89._4_4_;
  auVar144._8_4_ = auVar20._8_4_ * auVar89._8_4_;
  auVar144._12_4_ = auVar20._12_4_ * auVar89._12_4_;
  auVar144._16_4_ = auVar89._16_4_ * 0.0;
  auVar144._20_4_ = auVar89._20_4_ * 0.0;
  auVar144._24_4_ = auVar89._24_4_ * 0.0;
  auVar144._28_4_ = 0;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar10 * 0x10 + uVar67 * -2 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar76));
  auVar98._4_4_ = auVar78._4_4_ * auVar89._4_4_;
  auVar98._0_4_ = auVar78._0_4_ * auVar89._0_4_;
  auVar98._8_4_ = auVar78._8_4_ * auVar89._8_4_;
  auVar98._12_4_ = auVar78._12_4_ * auVar89._12_4_;
  auVar98._16_4_ = auVar89._16_4_ * 0.0;
  auVar98._20_4_ = auVar89._20_4_ * 0.0;
  auVar98._24_4_ = auVar89._24_4_ * 0.0;
  auVar98._28_4_ = auVar89._28_4_;
  auVar89 = vcvtdq2ps_avx(auVar86);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar76));
  auVar142._0_4_ = auVar78._0_4_ * auVar89._0_4_;
  auVar142._4_4_ = auVar78._4_4_ * auVar89._4_4_;
  auVar142._8_4_ = auVar78._8_4_ * auVar89._8_4_;
  auVar142._12_4_ = auVar78._12_4_ * auVar89._12_4_;
  auVar142._16_4_ = auVar89._16_4_ * 0.0;
  auVar142._20_4_ = auVar89._20_4_ * 0.0;
  auVar142._24_4_ = auVar89._24_4_ * 0.0;
  auVar142._28_4_ = 0;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 + uVar67 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar6));
  auVar92._4_4_ = auVar89._4_4_ * auVar80._4_4_;
  auVar92._0_4_ = auVar89._0_4_ * auVar80._0_4_;
  auVar92._8_4_ = auVar89._8_4_ * auVar80._8_4_;
  auVar92._12_4_ = auVar89._12_4_ * auVar80._12_4_;
  auVar92._16_4_ = auVar89._16_4_ * 0.0;
  auVar92._20_4_ = auVar89._20_4_ * 0.0;
  auVar92._24_4_ = auVar89._24_4_ * 0.0;
  auVar92._28_4_ = auVar89._28_4_;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 0x17 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar6));
  auVar97._0_4_ = auVar80._0_4_ * auVar89._0_4_;
  auVar97._4_4_ = auVar80._4_4_ * auVar89._4_4_;
  auVar97._8_4_ = auVar80._8_4_ * auVar89._8_4_;
  auVar97._12_4_ = auVar80._12_4_ * auVar89._12_4_;
  auVar97._16_4_ = auVar89._16_4_ * 0.0;
  auVar97._20_4_ = auVar89._20_4_ * 0.0;
  auVar97._24_4_ = auVar89._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar89 = vpminsd_avx2(auVar99,auVar144);
  auVar86 = vpminsd_avx2(auVar98,auVar142);
  auVar89 = vmaxps_avx(auVar89,auVar86);
  auVar86 = vpminsd_avx2(auVar92,auVar97);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar87._4_4_ = uVar132;
  auVar87._0_4_ = uVar132;
  auVar87._8_4_ = uVar132;
  auVar87._12_4_ = uVar132;
  auVar87._16_4_ = uVar132;
  auVar87._20_4_ = uVar132;
  auVar87._24_4_ = uVar132;
  auVar87._28_4_ = uVar132;
  auVar86 = vmaxps_avx512vl(auVar86,auVar87);
  auVar89 = vmaxps_avx(auVar89,auVar86);
  auVar86._8_4_ = 0x3f7ffffa;
  auVar86._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar86._12_4_ = 0x3f7ffffa;
  auVar86._16_4_ = 0x3f7ffffa;
  auVar86._20_4_ = 0x3f7ffffa;
  auVar86._24_4_ = 0x3f7ffffa;
  auVar86._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar89,auVar86);
  auVar89 = vpmaxsd_avx2(auVar99,auVar144);
  auVar86 = vpmaxsd_avx2(auVar98,auVar142);
  auVar89 = vminps_avx(auVar89,auVar86);
  auVar86 = vpmaxsd_avx2(auVar92,auVar97);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar88._4_4_ = uVar132;
  auVar88._0_4_ = uVar132;
  auVar88._8_4_ = uVar132;
  auVar88._12_4_ = uVar132;
  auVar88._16_4_ = uVar132;
  auVar88._20_4_ = uVar132;
  auVar88._24_4_ = uVar132;
  auVar88._28_4_ = uVar132;
  auVar86 = vminps_avx512vl(auVar86,auVar88);
  auVar89 = vminps_avx(auVar89,auVar86);
  auVar91._8_4_ = 0x3f800003;
  auVar91._0_8_ = 0x3f8000033f800003;
  auVar91._12_4_ = 0x3f800003;
  auVar91._16_4_ = 0x3f800003;
  auVar91._20_4_ = 0x3f800003;
  auVar91._24_4_ = 0x3f800003;
  auVar91._28_4_ = 0x3f800003;
  auVar89 = vmulps_avx512vl(auVar89,auVar91);
  uVar21 = vpcmpgtd_avx512vl(auVar90,_DAT_01fe9900);
  uVar141 = vcmpps_avx512vl(local_320,auVar89,2);
  if ((byte)((byte)uVar141 & (byte)uVar21) == 0) {
    bVar73 = 0;
  }
  else {
    uVar70 = (ulong)(byte)((byte)uVar141 & (byte)uVar21);
    auVar138 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar138);
    do {
      lVar22 = 0;
      for (uVar67 = uVar70; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar70 = uVar70 - 1 & uVar70;
      local_440._0_4_ = *(undefined4 *)(prim + lVar22 * 4 + 6);
      uVar67 = (ulong)(uint)((int)lVar22 << 6);
      uVar69 = *(uint *)(prim + 2);
      pGVar12 = (context->scene->geometries).items[uVar69].ptr;
      auVar20 = *(undefined1 (*) [16])(prim + uVar67 + lVar63 + 0x16);
      if (uVar70 != 0) {
        uVar71 = uVar70 - 1 & uVar70;
        for (uVar68 = uVar70; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
        }
        if (uVar71 != 0) {
          for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_890 = *(undefined1 (*) [16])(prim + uVar67 + lVar63 + 0x26);
      local_8a0 = *(undefined1 (*) [16])(prim + uVar67 + lVar63 + 0x36);
      _local_730 = *(undefined1 (*) [16])(prim + uVar67 + lVar63 + 0x46);
      local_800._0_8_ = pGVar12;
      iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar77 = vsubps_avx(auVar20,auVar78);
      uVar132 = auVar77._0_4_;
      auVar79._4_4_ = uVar132;
      auVar79._0_4_ = uVar132;
      auVar79._8_4_ = uVar132;
      auVar79._12_4_ = uVar132;
      auVar80 = vshufps_avx(auVar77,auVar77,0x55);
      auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar147 = pre->ray_space[k].vz.field_0.m128[0];
      fVar131 = pre->ray_space[k].vz.field_0.m128[1];
      fVar139 = pre->ray_space[k].vz.field_0.m128[2];
      fVar140 = pre->ray_space[k].vz.field_0.m128[3];
      auVar82._0_4_ = fVar147 * auVar77._0_4_;
      auVar82._4_4_ = fVar131 * auVar77._4_4_;
      auVar82._8_4_ = fVar139 * auVar77._8_4_;
      auVar82._12_4_ = fVar140 * auVar77._12_4_;
      auVar80 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar5,auVar80);
      auVar6 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar79);
      auVar80 = vshufps_avx(auVar20,auVar20,0xff);
      auVar76 = vsubps_avx(local_890,auVar78);
      uVar132 = auVar76._0_4_;
      auVar148._4_4_ = uVar132;
      auVar148._0_4_ = uVar132;
      auVar148._8_4_ = uVar132;
      auVar148._12_4_ = uVar132;
      auVar77 = vshufps_avx(auVar76,auVar76,0x55);
      auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
      auVar165._0_4_ = fVar147 * auVar76._0_4_;
      auVar165._4_4_ = fVar131 * auVar76._4_4_;
      auVar165._8_4_ = fVar139 * auVar76._8_4_;
      auVar165._12_4_ = fVar140 * auVar76._12_4_;
      auVar77 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar5,auVar77);
      auVar7 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar4,auVar148);
      auVar76 = vsubps_avx512vl(local_8a0,auVar78);
      uVar132 = auVar76._0_4_;
      auVar149._4_4_ = uVar132;
      auVar149._0_4_ = uVar132;
      auVar149._8_4_ = uVar132;
      auVar149._12_4_ = uVar132;
      auVar77 = vshufps_avx(auVar76,auVar76,0x55);
      auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
      auVar167._0_4_ = fVar147 * auVar76._0_4_;
      auVar167._4_4_ = fVar131 * auVar76._4_4_;
      auVar167._8_4_ = fVar139 * auVar76._8_4_;
      auVar167._12_4_ = fVar140 * auVar76._12_4_;
      auVar77 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar5,auVar77);
      auVar76 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar4,auVar149);
      auVar77 = vsubps_avx512vl(_local_730,auVar78);
      uVar132 = auVar77._0_4_;
      auVar81._4_4_ = uVar132;
      auVar81._0_4_ = uVar132;
      auVar81._8_4_ = uVar132;
      auVar81._12_4_ = uVar132;
      auVar78 = vshufps_avx(auVar77,auVar77,0x55);
      auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
      auVar168._0_4_ = fVar147 * auVar77._0_4_;
      auVar168._4_4_ = fVar131 * auVar77._4_4_;
      auVar168._8_4_ = fVar139 * auVar77._8_4_;
      auVar168._12_4_ = fVar140 * auVar77._12_4_;
      auVar78 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar5,auVar78);
      auVar77 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar81);
      lVar22 = (long)iVar11 * 0x44;
      auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar22);
      local_760 = vbroadcastss_avx512vl(auVar6);
      auVar137._8_4_ = 1;
      auVar137._0_8_ = 0x100000001;
      auVar137._12_4_ = 1;
      auVar137._16_4_ = 1;
      auVar137._20_4_ = 1;
      auVar137._24_4_ = 1;
      auVar137._28_4_ = 1;
      local_7a0 = vpermps_avx2(auVar137,ZEXT1632(auVar6));
      auVar86 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x484);
      local_7c0 = vbroadcastss_avx512vl(auVar7);
      local_7e0 = vpermps_avx2(auVar137,ZEXT1632(auVar7));
      auVar87 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x908);
      local_8c0 = vbroadcastss_avx512vl(auVar76);
      local_880 = vpermps_avx512vl(auVar137,ZEXT1632(auVar76));
      auVar138 = ZEXT3264(local_880);
      auVar88 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0xd8c);
      local_840 = vbroadcastss_avx512vl(auVar77);
      auVar185 = ZEXT3264(local_840);
      local_860 = vpermps_avx512vl(auVar137,ZEXT1632(auVar77));
      auVar186 = ZEXT3264(local_860);
      auVar91 = vmulps_avx512vl(local_840,auVar88);
      auVar90 = vmulps_avx512vl(local_860,auVar88);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar87,local_8c0);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar87,local_880);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,local_7c0);
      auVar78 = vfmadd231ps_fma(auVar90,auVar86,local_7e0);
      auVar92 = vfmadd231ps_avx512vl(auVar91,auVar89,local_760);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar89,local_7a0);
      auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar22);
      auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x484);
      auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x908);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0xd8c);
      auVar85 = vmulps_avx512vl(local_840,auVar98);
      auVar94 = vmulps_avx512vl(local_860,auVar98);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar99,local_8c0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,local_880);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar90,local_7c0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_7e0);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar91,local_760);
      auVar8 = vfmadd231ps_fma(auVar94,auVar91,local_7a0);
      auVar94 = vsubps_avx512vl(auVar85,auVar92);
      auVar95 = vsubps_avx512vl(ZEXT1632(auVar8),auVar93);
      auVar83 = vmulps_avx512vl(auVar93,auVar94);
      auVar84 = vmulps_avx512vl(auVar92,auVar95);
      auVar83 = vsubps_avx512vl(auVar83,auVar84);
      auVar78 = vshufps_avx(local_890,local_890,0xff);
      uVar141 = auVar80._0_8_;
      local_340._8_8_ = uVar141;
      local_340._0_8_ = uVar141;
      local_340._16_8_ = uVar141;
      local_340._24_8_ = uVar141;
      local_360 = vbroadcastsd_avx512vl(auVar78);
      auVar78 = vshufps_avx512vl(local_8a0,local_8a0,0xff);
      local_380 = vbroadcastsd_avx512vl(auVar78);
      auVar78 = vshufps_avx512vl(_local_730,_local_730,0xff);
      uVar141 = auVar78._0_8_;
      register0x000012c8 = uVar141;
      local_3a0 = uVar141;
      register0x000012d0 = uVar141;
      register0x000012d8 = uVar141;
      auVar84 = vmulps_avx512vl(_local_3a0,auVar88);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar87,local_380);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar86,local_360);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar89,local_340);
      auVar96 = vmulps_avx512vl(_local_3a0,auVar98);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,local_380);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar90,local_360);
      auVar9 = vfmadd231ps_fma(auVar96,auVar91,local_340);
      auVar96 = vmulps_avx512vl(auVar95,auVar95);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar94);
      auVar97 = vmaxps_avx512vl(auVar84,ZEXT1632(auVar9));
      auVar97 = vmulps_avx512vl(auVar97,auVar97);
      auVar96 = vmulps_avx512vl(auVar97,auVar96);
      auVar83 = vmulps_avx512vl(auVar83,auVar83);
      uVar141 = vcmpps_avx512vl(auVar83,auVar96,2);
      auVar78 = vblendps_avx(auVar6,auVar20,8);
      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar80 = vandps_avx512vl(auVar78,auVar79);
      auVar78 = vblendps_avx(auVar7,local_890,8);
      auVar78 = vandps_avx512vl(auVar78,auVar79);
      auVar80 = vmaxps_avx(auVar80,auVar78);
      auVar78 = vblendps_avx(auVar76,local_8a0,8);
      auVar81 = vandps_avx512vl(auVar78,auVar79);
      auVar78 = vblendps_avx(auVar77,_local_730,8);
      auVar78 = vandps_avx512vl(auVar78,auVar79);
      auVar78 = vmaxps_avx(auVar81,auVar78);
      auVar78 = vmaxps_avx(auVar80,auVar78);
      auVar80 = vmovshdup_avx(auVar78);
      auVar80 = vmaxss_avx(auVar80,auVar78);
      auVar78 = vshufpd_avx(auVar78,auVar78,1);
      auVar78 = vmaxss_avx(auVar78,auVar80);
      auVar80 = vcvtsi2ss_avx512f(local_8a0,iVar11);
      local_480._0_16_ = auVar80;
      auVar169._0_4_ = auVar80._0_4_;
      auVar169._4_4_ = auVar169._0_4_;
      auVar169._8_4_ = auVar169._0_4_;
      auVar169._12_4_ = auVar169._0_4_;
      auVar169._16_4_ = auVar169._0_4_;
      auVar169._20_4_ = auVar169._0_4_;
      auVar169._24_4_ = auVar169._0_4_;
      auVar169._28_4_ = auVar169._0_4_;
      uVar21 = vcmpps_avx512vl(auVar169,_DAT_01faff40,0xe);
      bVar73 = (byte)uVar141 & (byte)uVar21;
      local_680 = auVar78._0_4_ * 4.7683716e-07;
      auVar145._8_4_ = 2;
      auVar145._0_8_ = 0x200000002;
      auVar145._12_4_ = 2;
      auVar145._16_4_ = 2;
      auVar145._20_4_ = 2;
      auVar145._24_4_ = 2;
      auVar145._28_4_ = 2;
      local_3c0 = vpermps_avx512vl(auVar145,ZEXT1632(auVar6));
      local_3e0 = vpermps_avx512vl(auVar145,ZEXT1632(auVar7));
      local_400 = vpermps_avx512vl(auVar145,ZEXT1632(auVar76));
      local_820 = vpermps_avx2(auVar145,ZEXT1632(auVar77));
      uVar132 = *(undefined4 *)(ray + k * 4 + 0xc0);
      fStack_67c = 0.0;
      fStack_678 = 0.0;
      fStack_674 = 0.0;
      auVar78 = auVar95._0_16_;
      if (bVar73 == 0) {
        uVar67 = 0;
        auVar78 = vxorps_avx512vl(auVar78,auVar78);
        auVar183 = ZEXT1664(auVar78);
        auVar180 = ZEXT3264(local_760);
        auVar181 = ZEXT3264(local_7a0);
        auVar182 = ZEXT3264(local_7c0);
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar184 = ZEXT3264(auVar89);
        auVar179 = ZEXT3264(local_7e0);
        auVar178 = ZEXT3264(local_8c0);
      }
      else {
        auVar98 = vmulps_avx512vl(local_820,auVar98);
        auVar99 = vfmadd213ps_avx512vl(auVar99,local_400,auVar98);
        auVar90 = vfmadd213ps_avx512vl(auVar90,local_3e0,auVar99);
        auVar90 = vfmadd213ps_avx512vl(auVar91,local_3c0,auVar90);
        auVar88 = vmulps_avx512vl(local_820,auVar88);
        auVar87 = vfmadd213ps_avx512vl(auVar87,local_400,auVar88);
        auVar99 = vfmadd213ps_avx512vl(auVar86,local_3e0,auVar87);
        auVar86 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1210);
        auVar87 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1694);
        auVar88 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1b18);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1f9c);
        auVar99 = vfmadd213ps_avx512vl(auVar89,local_3c0,auVar99);
        auVar89 = vmulps_avx512vl(local_840,auVar91);
        auVar98 = vmulps_avx512vl(local_860,auVar91);
        auVar91 = vmulps_avx512vl(local_820,auVar91);
        auVar80 = vfmadd231ps_fma(auVar89,auVar88,local_8c0);
        auVar89 = vfmadd231ps_avx512vl(auVar98,auVar88,local_880);
        auVar88 = vfmadd231ps_avx512vl(auVar91,local_400,auVar88);
        auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar87,local_7c0);
        auVar179 = ZEXT3264(local_7e0);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,local_7e0);
        auVar98 = vfmadd231ps_avx512vl(auVar88,local_3e0,auVar87);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,local_760);
        auVar83 = vfmadd231ps_avx512vl(auVar89,auVar86,local_7a0);
        auVar89 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1210);
        auVar87 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1b18);
        auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1f9c);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_3c0,auVar86);
        auVar86 = vmulps_avx512vl(local_840,auVar88);
        auVar96 = vmulps_avx512vl(local_860,auVar88);
        auVar88 = vmulps_avx512vl(local_820,auVar88);
        auVar80 = vfmadd231ps_fma(auVar86,auVar87,local_8c0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar87,local_880);
        auVar87 = vfmadd231ps_avx512vl(auVar88,local_400,auVar87);
        auVar86 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1694);
        auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar86,local_7c0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar86,local_7e0);
        auVar86 = vfmadd231ps_avx512vl(auVar87,local_3e0,auVar86);
        auVar87 = vfmadd231ps_avx512vl(auVar88,auVar89,local_760);
        auVar88 = vfmadd231ps_avx512vl(auVar96,auVar89,local_7a0);
        auVar96 = vfmadd231ps_avx512vl(auVar86,local_3c0,auVar89);
        auVar176._8_4_ = 0x7fffffff;
        auVar176._0_8_ = 0x7fffffff7fffffff;
        auVar176._12_4_ = 0x7fffffff;
        auVar176._16_4_ = 0x7fffffff;
        auVar176._20_4_ = 0x7fffffff;
        auVar176._24_4_ = 0x7fffffff;
        auVar176._28_4_ = 0x7fffffff;
        auVar89 = vandps_avx(auVar91,auVar176);
        auVar86 = vandps_avx(auVar83,auVar176);
        auVar86 = vmaxps_avx(auVar89,auVar86);
        auVar89 = vandps_avx(auVar98,auVar176);
        auVar89 = vmaxps_avx(auVar86,auVar89);
        auVar98 = vbroadcastss_avx512vl(ZEXT416((uint)local_680));
        uVar67 = vcmpps_avx512vl(auVar89,auVar98,1);
        bVar14 = (bool)((byte)uVar67 & 1);
        auVar100._0_4_ = (float)((uint)bVar14 * auVar94._0_4_ | (uint)!bVar14 * auVar91._0_4_);
        bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar14 * auVar94._4_4_ | (uint)!bVar14 * auVar91._4_4_);
        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar14 * auVar94._8_4_ | (uint)!bVar14 * auVar91._8_4_);
        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar14 * auVar94._12_4_ | (uint)!bVar14 * auVar91._12_4_);
        bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar14 * auVar94._16_4_ | (uint)!bVar14 * auVar91._16_4_);
        bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar14 * auVar94._20_4_ | (uint)!bVar14 * auVar91._20_4_);
        bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar14 * auVar94._24_4_ | (uint)!bVar14 * auVar91._24_4_);
        bVar14 = SUB81(uVar67 >> 7,0);
        auVar100._28_4_ = (uint)bVar14 * auVar94._28_4_ | (uint)!bVar14 * auVar91._28_4_;
        bVar14 = (bool)((byte)uVar67 & 1);
        auVar101._0_4_ = (float)((uint)bVar14 * auVar95._0_4_ | (uint)!bVar14 * auVar83._0_4_);
        bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar83._4_4_);
        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar83._8_4_);
        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar83._12_4_);
        bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * auVar83._16_4_);
        bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * auVar83._20_4_);
        bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * auVar83._24_4_);
        bVar14 = SUB81(uVar67 >> 7,0);
        auVar101._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * auVar83._28_4_;
        auVar89 = vandps_avx(auVar176,auVar87);
        auVar86 = vandps_avx(auVar88,auVar176);
        auVar86 = vmaxps_avx(auVar89,auVar86);
        auVar89 = vandps_avx(auVar96,auVar176);
        auVar89 = vmaxps_avx(auVar86,auVar89);
        uVar67 = vcmpps_avx512vl(auVar89,auVar98,1);
        bVar14 = (bool)((byte)uVar67 & 1);
        auVar102._0_4_ = (float)((uint)bVar14 * auVar94._0_4_ | (uint)!bVar14 * auVar87._0_4_);
        bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar14 * auVar94._4_4_ | (uint)!bVar14 * auVar87._4_4_);
        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar14 * auVar94._8_4_ | (uint)!bVar14 * auVar87._8_4_);
        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar14 * auVar94._12_4_ | (uint)!bVar14 * auVar87._12_4_);
        bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar14 * auVar94._16_4_ | (uint)!bVar14 * auVar87._16_4_);
        bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar14 * auVar94._20_4_ | (uint)!bVar14 * auVar87._20_4_);
        bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar14 * auVar94._24_4_ | (uint)!bVar14 * auVar87._24_4_);
        bVar14 = SUB81(uVar67 >> 7,0);
        auVar102._28_4_ = (uint)bVar14 * auVar94._28_4_ | (uint)!bVar14 * auVar87._28_4_;
        bVar14 = (bool)((byte)uVar67 & 1);
        auVar103._0_4_ = (float)((uint)bVar14 * auVar95._0_4_ | (uint)!bVar14 * auVar88._0_4_);
        bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar88._4_4_);
        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar88._8_4_);
        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar88._12_4_);
        bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * auVar88._16_4_);
        bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * auVar88._20_4_);
        bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * auVar88._24_4_);
        bVar14 = SUB81(uVar67 >> 7,0);
        auVar103._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * auVar88._28_4_;
        auVar82 = vxorps_avx512vl(auVar78,auVar78);
        auVar183 = ZEXT1664(auVar82);
        auVar89 = vfmadd213ps_avx512vl(auVar100,auVar100,ZEXT1632(auVar82));
        auVar78 = vfmadd231ps_fma(auVar89,auVar101,auVar101);
        auVar89 = vrsqrt14ps_avx512vl(ZEXT1632(auVar78));
        fVar147 = auVar89._0_4_;
        fVar131 = auVar89._4_4_;
        fVar139 = auVar89._8_4_;
        fVar140 = auVar89._12_4_;
        fVar160 = auVar89._16_4_;
        fVar162 = auVar89._20_4_;
        fVar74 = auVar89._24_4_;
        auVar29._4_4_ = fVar131 * fVar131 * fVar131 * auVar78._4_4_ * -0.5;
        auVar29._0_4_ = fVar147 * fVar147 * fVar147 * auVar78._0_4_ * -0.5;
        auVar29._8_4_ = fVar139 * fVar139 * fVar139 * auVar78._8_4_ * -0.5;
        auVar29._12_4_ = fVar140 * fVar140 * fVar140 * auVar78._12_4_ * -0.5;
        auVar29._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar29._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar29._24_4_ = fVar74 * fVar74 * fVar74 * -0.0;
        auVar29._28_4_ = 0;
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar87 = vfmadd231ps_avx512vl(auVar29,auVar86,auVar89);
        auVar30._4_4_ = auVar101._4_4_ * auVar87._4_4_;
        auVar30._0_4_ = auVar101._0_4_ * auVar87._0_4_;
        auVar30._8_4_ = auVar101._8_4_ * auVar87._8_4_;
        auVar30._12_4_ = auVar101._12_4_ * auVar87._12_4_;
        auVar30._16_4_ = auVar101._16_4_ * auVar87._16_4_;
        auVar30._20_4_ = auVar101._20_4_ * auVar87._20_4_;
        auVar30._24_4_ = auVar101._24_4_ * auVar87._24_4_;
        auVar30._28_4_ = auVar89._28_4_;
        auVar31._4_4_ = auVar87._4_4_ * -auVar100._4_4_;
        auVar31._0_4_ = auVar87._0_4_ * -auVar100._0_4_;
        auVar31._8_4_ = auVar87._8_4_ * -auVar100._8_4_;
        auVar31._12_4_ = auVar87._12_4_ * -auVar100._12_4_;
        auVar31._16_4_ = auVar87._16_4_ * -auVar100._16_4_;
        auVar31._20_4_ = auVar87._20_4_ * -auVar100._20_4_;
        auVar31._24_4_ = auVar87._24_4_ * -auVar100._24_4_;
        auVar31._28_4_ = auVar100._28_4_ ^ 0x80000000;
        auVar89 = vmulps_avx512vl(auVar87,ZEXT1632(auVar82));
        auVar94 = ZEXT1632(auVar82);
        auVar88 = vfmadd213ps_avx512vl(auVar102,auVar102,auVar94);
        auVar78 = vfmadd231ps_fma(auVar88,auVar103,auVar103);
        auVar88 = vrsqrt14ps_avx512vl(ZEXT1632(auVar78));
        fVar147 = auVar88._0_4_;
        fVar131 = auVar88._4_4_;
        fVar139 = auVar88._8_4_;
        fVar140 = auVar88._12_4_;
        fVar160 = auVar88._16_4_;
        fVar162 = auVar88._20_4_;
        fVar74 = auVar88._24_4_;
        auVar32._4_4_ = fVar131 * fVar131 * fVar131 * auVar78._4_4_ * -0.5;
        auVar32._0_4_ = fVar147 * fVar147 * fVar147 * auVar78._0_4_ * -0.5;
        auVar32._8_4_ = fVar139 * fVar139 * fVar139 * auVar78._8_4_ * -0.5;
        auVar32._12_4_ = fVar140 * fVar140 * fVar140 * auVar78._12_4_ * -0.5;
        auVar32._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar32._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar32._24_4_ = fVar74 * fVar74 * fVar74 * -0.0;
        auVar32._28_4_ = 0;
        auVar86 = vfmadd231ps_avx512vl(auVar32,auVar86,auVar88);
        auVar33._4_4_ = auVar103._4_4_ * auVar86._4_4_;
        auVar33._0_4_ = auVar103._0_4_ * auVar86._0_4_;
        auVar33._8_4_ = auVar103._8_4_ * auVar86._8_4_;
        auVar33._12_4_ = auVar103._12_4_ * auVar86._12_4_;
        auVar33._16_4_ = auVar103._16_4_ * auVar86._16_4_;
        auVar33._20_4_ = auVar103._20_4_ * auVar86._20_4_;
        auVar33._24_4_ = auVar103._24_4_ * auVar86._24_4_;
        auVar33._28_4_ = auVar88._28_4_;
        auVar34._4_4_ = -auVar102._4_4_ * auVar86._4_4_;
        auVar34._0_4_ = -auVar102._0_4_ * auVar86._0_4_;
        auVar34._8_4_ = -auVar102._8_4_ * auVar86._8_4_;
        auVar34._12_4_ = -auVar102._12_4_ * auVar86._12_4_;
        auVar34._16_4_ = -auVar102._16_4_ * auVar86._16_4_;
        auVar34._20_4_ = -auVar102._20_4_ * auVar86._20_4_;
        auVar34._24_4_ = -auVar102._24_4_ * auVar86._24_4_;
        auVar34._28_4_ = auVar87._28_4_;
        auVar86 = vmulps_avx512vl(auVar86,auVar94);
        auVar78 = vfmadd213ps_fma(auVar30,auVar84,auVar92);
        auVar80 = vfmadd213ps_fma(auVar31,auVar84,auVar93);
        auVar87 = vfmadd213ps_avx512vl(auVar89,auVar84,auVar99);
        auVar88 = vfmadd213ps_avx512vl(auVar33,ZEXT1632(auVar9),auVar85);
        auVar79 = vfnmadd213ps_fma(auVar30,auVar84,auVar92);
        auVar98 = ZEXT1632(auVar9);
        auVar77 = vfmadd213ps_fma(auVar34,auVar98,ZEXT1632(auVar8));
        auVar81 = vfnmadd213ps_fma(auVar31,auVar84,auVar93);
        auVar76 = vfmadd213ps_fma(auVar86,auVar98,auVar90);
        auVar91 = vfnmadd231ps_avx512vl(auVar99,auVar84,auVar89);
        auVar148 = vfnmadd213ps_fma(auVar33,auVar98,auVar85);
        auVar8 = vfnmadd213ps_fma(auVar34,auVar98,ZEXT1632(auVar8));
        auVar149 = vfnmadd231ps_fma(auVar90,ZEXT1632(auVar9),auVar86);
        auVar86 = vsubps_avx512vl(auVar88,ZEXT1632(auVar79));
        auVar89 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar81));
        auVar90 = vsubps_avx512vl(ZEXT1632(auVar76),auVar91);
        auVar99 = vmulps_avx512vl(auVar89,auVar91);
        auVar6 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar81),auVar90);
        auVar35._4_4_ = auVar79._4_4_ * auVar90._4_4_;
        auVar35._0_4_ = auVar79._0_4_ * auVar90._0_4_;
        auVar35._8_4_ = auVar79._8_4_ * auVar90._8_4_;
        auVar35._12_4_ = auVar79._12_4_ * auVar90._12_4_;
        auVar35._16_4_ = auVar90._16_4_ * 0.0;
        auVar35._20_4_ = auVar90._20_4_ * 0.0;
        auVar35._24_4_ = auVar90._24_4_ * 0.0;
        auVar35._28_4_ = auVar90._28_4_;
        auVar90 = vfmsub231ps_avx512vl(auVar35,auVar91,auVar86);
        auVar36._4_4_ = auVar81._4_4_ * auVar86._4_4_;
        auVar36._0_4_ = auVar81._0_4_ * auVar86._0_4_;
        auVar36._8_4_ = auVar81._8_4_ * auVar86._8_4_;
        auVar36._12_4_ = auVar81._12_4_ * auVar86._12_4_;
        auVar36._16_4_ = auVar86._16_4_ * 0.0;
        auVar36._20_4_ = auVar86._20_4_ * 0.0;
        auVar36._24_4_ = auVar86._24_4_ * 0.0;
        auVar36._28_4_ = auVar86._28_4_;
        auVar7 = vfmsub231ps_fma(auVar36,ZEXT1632(auVar79),auVar89);
        auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar94,auVar90);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,ZEXT1632(auVar6));
        auVar94 = ZEXT1632(auVar82);
        uVar67 = vcmpps_avx512vl(auVar89,auVar94,2);
        bVar66 = (byte)uVar67;
        fVar74 = (float)((uint)(bVar66 & 1) * auVar78._0_4_ |
                        (uint)!(bool)(bVar66 & 1) * auVar148._0_4_);
        bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
        fVar146 = (float)((uint)bVar14 * auVar78._4_4_ | (uint)!bVar14 * auVar148._4_4_);
        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
        fVar124 = (float)((uint)bVar14 * auVar78._8_4_ | (uint)!bVar14 * auVar148._8_4_);
        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
        fVar127 = (float)((uint)bVar14 * auVar78._12_4_ | (uint)!bVar14 * auVar148._12_4_);
        auVar99 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar124,CONCAT44(fVar146,fVar74))));
        fVar75 = (float)((uint)(bVar66 & 1) * auVar80._0_4_ |
                        (uint)!(bool)(bVar66 & 1) * auVar8._0_4_);
        bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
        fVar123 = (float)((uint)bVar14 * auVar80._4_4_ | (uint)!bVar14 * auVar8._4_4_);
        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
        fVar125 = (float)((uint)bVar14 * auVar80._8_4_ | (uint)!bVar14 * auVar8._8_4_);
        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
        fVar128 = (float)((uint)bVar14 * auVar80._12_4_ | (uint)!bVar14 * auVar8._12_4_);
        auVar98 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar125,CONCAT44(fVar123,fVar75))));
        auVar104._0_4_ =
             (float)((uint)(bVar66 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar149._0_4_
                    );
        bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar14 * auVar87._4_4_ | (uint)!bVar14 * auVar149._4_4_);
        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar14 * auVar87._8_4_ | (uint)!bVar14 * auVar149._8_4_);
        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar14 * auVar87._12_4_ | (uint)!bVar14 * auVar149._12_4_);
        fVar131 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar87._16_4_);
        auVar104._16_4_ = fVar131;
        fVar147 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar87._20_4_);
        auVar104._20_4_ = fVar147;
        fVar139 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar87._24_4_);
        auVar104._24_4_ = fVar139;
        iVar1 = (uint)(byte)(uVar67 >> 7) * auVar87._28_4_;
        auVar104._28_4_ = iVar1;
        auVar86 = vblendmps_avx512vl(ZEXT1632(auVar79),auVar88);
        auVar105._0_4_ =
             (uint)(bVar66 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar6._0_4_;
        bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar105._4_4_ = (uint)bVar14 * auVar86._4_4_ | (uint)!bVar14 * auVar6._4_4_;
        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar105._8_4_ = (uint)bVar14 * auVar86._8_4_ | (uint)!bVar14 * auVar6._8_4_;
        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar105._12_4_ = (uint)bVar14 * auVar86._12_4_ | (uint)!bVar14 * auVar6._12_4_;
        auVar105._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar86._16_4_;
        auVar105._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar86._20_4_;
        auVar105._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar86._24_4_;
        auVar105._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar86._28_4_;
        auVar86 = vblendmps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar77));
        auVar106._0_4_ =
             (float)((uint)(bVar66 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar80._0_4_)
        ;
        bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar14 * auVar86._4_4_ | (uint)!bVar14 * auVar80._4_4_);
        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar14 * auVar86._8_4_ | (uint)!bVar14 * auVar80._8_4_);
        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar14 * auVar86._12_4_ | (uint)!bVar14 * auVar80._12_4_);
        fVar140 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar86._16_4_);
        auVar106._16_4_ = fVar140;
        fVar160 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar86._20_4_);
        auVar106._20_4_ = fVar160;
        fVar162 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar86._24_4_);
        auVar106._24_4_ = fVar162;
        auVar106._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar86._28_4_;
        auVar86 = vblendmps_avx512vl(auVar91,ZEXT1632(auVar76));
        auVar107._0_4_ =
             (float)((uint)(bVar66 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar87._0_4_)
        ;
        bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar14 * auVar86._4_4_ | (uint)!bVar14 * auVar87._4_4_);
        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar14 * auVar86._8_4_ | (uint)!bVar14 * auVar87._8_4_);
        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar14 * auVar86._12_4_ | (uint)!bVar14 * auVar87._12_4_);
        bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar14 * auVar86._16_4_ | (uint)!bVar14 * auVar87._16_4_);
        bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar14 * auVar86._20_4_ | (uint)!bVar14 * auVar87._20_4_);
        bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar14 * auVar86._24_4_ | (uint)!bVar14 * auVar87._24_4_);
        bVar14 = SUB81(uVar67 >> 7,0);
        auVar107._28_4_ = (uint)bVar14 * auVar86._28_4_ | (uint)!bVar14 * auVar87._28_4_;
        auVar108._0_4_ =
             (uint)(bVar66 & 1) * (int)auVar79._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar88._0_4_;
        bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar14 * (int)auVar79._4_4_ | (uint)!bVar14 * auVar88._4_4_;
        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar14 * (int)auVar79._8_4_ | (uint)!bVar14 * auVar88._8_4_;
        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar14 * (int)auVar79._12_4_ | (uint)!bVar14 * auVar88._12_4_;
        auVar108._16_4_ = (uint)!(bool)((byte)(uVar67 >> 4) & 1) * auVar88._16_4_;
        auVar108._20_4_ = (uint)!(bool)((byte)(uVar67 >> 5) & 1) * auVar88._20_4_;
        auVar108._24_4_ = (uint)!(bool)((byte)(uVar67 >> 6) & 1) * auVar88._24_4_;
        auVar108._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar88._28_4_;
        bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar67 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar109._0_4_ =
             (uint)(bVar66 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar76._0_4_;
        bVar15 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar15 * auVar91._4_4_ | (uint)!bVar15 * auVar76._4_4_;
        bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar15 * auVar91._8_4_ | (uint)!bVar15 * auVar76._8_4_;
        bVar15 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar15 * auVar91._12_4_ | (uint)!bVar15 * auVar76._12_4_;
        auVar109._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar91._16_4_;
        auVar109._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar91._20_4_;
        auVar109._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar91._24_4_;
        iVar2 = (uint)(byte)(uVar67 >> 7) * auVar91._28_4_;
        auVar109._28_4_ = iVar2;
        auVar92 = vsubps_avx512vl(auVar108,auVar99);
        auVar86 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar81._12_4_ |
                                                (uint)!bVar17 * auVar77._12_4_,
                                                CONCAT48((uint)bVar16 * (int)auVar81._8_4_ |
                                                         (uint)!bVar16 * auVar77._8_4_,
                                                         CONCAT44((uint)bVar14 * (int)auVar81._4_4_
                                                                  | (uint)!bVar14 * auVar77._4_4_,
                                                                  (uint)(bVar66 & 1) *
                                                                  (int)auVar81._0_4_ |
                                                                  (uint)!(bool)(bVar66 & 1) *
                                                                  auVar77._0_4_)))),auVar98);
        auVar87 = vsubps_avx(auVar109,auVar104);
        auVar88 = vsubps_avx(auVar99,auVar105);
        auVar91 = vsubps_avx(auVar98,auVar106);
        auVar90 = vsubps_avx(auVar104,auVar107);
        auVar37._4_4_ = auVar87._4_4_ * fVar146;
        auVar37._0_4_ = auVar87._0_4_ * fVar74;
        auVar37._8_4_ = auVar87._8_4_ * fVar124;
        auVar37._12_4_ = auVar87._12_4_ * fVar127;
        auVar37._16_4_ = auVar87._16_4_ * 0.0;
        auVar37._20_4_ = auVar87._20_4_ * 0.0;
        auVar37._24_4_ = auVar87._24_4_ * 0.0;
        auVar37._28_4_ = iVar2;
        auVar78 = vfmsub231ps_fma(auVar37,auVar104,auVar92);
        auVar38._4_4_ = fVar123 * auVar92._4_4_;
        auVar38._0_4_ = fVar75 * auVar92._0_4_;
        auVar38._8_4_ = fVar125 * auVar92._8_4_;
        auVar38._12_4_ = fVar128 * auVar92._12_4_;
        auVar38._16_4_ = auVar92._16_4_ * 0.0;
        auVar38._20_4_ = auVar92._20_4_ * 0.0;
        auVar38._24_4_ = auVar92._24_4_ * 0.0;
        auVar38._28_4_ = auVar89._28_4_;
        auVar80 = vfmsub231ps_fma(auVar38,auVar99,auVar86);
        auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar94,ZEXT1632(auVar78));
        auVar154._0_4_ = auVar86._0_4_ * auVar104._0_4_;
        auVar154._4_4_ = auVar86._4_4_ * auVar104._4_4_;
        auVar154._8_4_ = auVar86._8_4_ * auVar104._8_4_;
        auVar154._12_4_ = auVar86._12_4_ * auVar104._12_4_;
        auVar154._16_4_ = auVar86._16_4_ * fVar131;
        auVar154._20_4_ = auVar86._20_4_ * fVar147;
        auVar154._24_4_ = auVar86._24_4_ * fVar139;
        auVar154._28_4_ = 0;
        auVar78 = vfmsub231ps_fma(auVar154,auVar98,auVar87);
        auVar93 = vfmadd231ps_avx512vl(auVar89,auVar94,ZEXT1632(auVar78));
        auVar89 = vmulps_avx512vl(auVar90,auVar105);
        auVar89 = vfmsub231ps_avx512vl(auVar89,auVar88,auVar107);
        auVar39._4_4_ = auVar91._4_4_ * auVar107._4_4_;
        auVar39._0_4_ = auVar91._0_4_ * auVar107._0_4_;
        auVar39._8_4_ = auVar91._8_4_ * auVar107._8_4_;
        auVar39._12_4_ = auVar91._12_4_ * auVar107._12_4_;
        auVar39._16_4_ = auVar91._16_4_ * auVar107._16_4_;
        auVar39._20_4_ = auVar91._20_4_ * auVar107._20_4_;
        auVar39._24_4_ = auVar91._24_4_ * auVar107._24_4_;
        auVar39._28_4_ = auVar107._28_4_;
        auVar78 = vfmsub231ps_fma(auVar39,auVar106,auVar90);
        auVar155._0_4_ = auVar106._0_4_ * auVar88._0_4_;
        auVar155._4_4_ = auVar106._4_4_ * auVar88._4_4_;
        auVar155._8_4_ = auVar106._8_4_ * auVar88._8_4_;
        auVar155._12_4_ = auVar106._12_4_ * auVar88._12_4_;
        auVar155._16_4_ = fVar140 * auVar88._16_4_;
        auVar155._20_4_ = fVar160 * auVar88._20_4_;
        auVar155._24_4_ = fVar162 * auVar88._24_4_;
        auVar155._28_4_ = 0;
        auVar80 = vfmsub231ps_fma(auVar155,auVar91,auVar105);
        auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar94,auVar89);
        auVar85 = vfmadd231ps_avx512vl(auVar89,auVar94,ZEXT1632(auVar78));
        auVar89 = vmaxps_avx(auVar93,auVar85);
        uVar141 = vcmpps_avx512vl(auVar89,auVar94,2);
        bVar73 = bVar73 & (byte)uVar141;
        auVar180 = ZEXT3264(local_760);
        auVar181 = ZEXT3264(local_7a0);
        auVar182 = ZEXT3264(local_7c0);
        auVar178 = ZEXT3264(local_8c0);
        if (bVar73 == 0) {
          uVar67 = 0;
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar184 = ZEXT3264(auVar89);
          auVar138 = ZEXT3264(local_880);
          auVar185 = ZEXT3264(local_840);
          auVar186 = ZEXT3264(local_860);
        }
        else {
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar172._4_4_ = uVar3;
          auVar172._0_4_ = uVar3;
          auVar172._8_4_ = uVar3;
          auVar172._12_4_ = uVar3;
          auVar172._16_4_ = uVar3;
          auVar172._20_4_ = uVar3;
          auVar172._24_4_ = uVar3;
          auVar172._28_4_ = uVar3;
          auVar174 = ZEXT3264(auVar172);
          auVar40._4_4_ = auVar90._4_4_ * auVar86._4_4_;
          auVar40._0_4_ = auVar90._0_4_ * auVar86._0_4_;
          auVar40._8_4_ = auVar90._8_4_ * auVar86._8_4_;
          auVar40._12_4_ = auVar90._12_4_ * auVar86._12_4_;
          auVar40._16_4_ = auVar90._16_4_ * auVar86._16_4_;
          auVar40._20_4_ = auVar90._20_4_ * auVar86._20_4_;
          auVar40._24_4_ = auVar90._24_4_ * auVar86._24_4_;
          auVar40._28_4_ = auVar89._28_4_;
          auVar77 = vfmsub231ps_fma(auVar40,auVar91,auVar87);
          auVar41._4_4_ = auVar87._4_4_ * auVar88._4_4_;
          auVar41._0_4_ = auVar87._0_4_ * auVar88._0_4_;
          auVar41._8_4_ = auVar87._8_4_ * auVar88._8_4_;
          auVar41._12_4_ = auVar87._12_4_ * auVar88._12_4_;
          auVar41._16_4_ = auVar87._16_4_ * auVar88._16_4_;
          auVar41._20_4_ = auVar87._20_4_ * auVar88._20_4_;
          auVar41._24_4_ = auVar87._24_4_ * auVar88._24_4_;
          auVar41._28_4_ = auVar87._28_4_;
          auVar80 = vfmsub231ps_fma(auVar41,auVar92,auVar90);
          auVar42._4_4_ = auVar91._4_4_ * auVar92._4_4_;
          auVar42._0_4_ = auVar91._0_4_ * auVar92._0_4_;
          auVar42._8_4_ = auVar91._8_4_ * auVar92._8_4_;
          auVar42._12_4_ = auVar91._12_4_ * auVar92._12_4_;
          auVar42._16_4_ = auVar91._16_4_ * auVar92._16_4_;
          auVar42._20_4_ = auVar91._20_4_ * auVar92._20_4_;
          auVar42._24_4_ = auVar91._24_4_ * auVar92._24_4_;
          auVar42._28_4_ = auVar91._28_4_;
          auVar76 = vfmsub231ps_fma(auVar42,auVar88,auVar86);
          auVar78 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar80),ZEXT1632(auVar76));
          auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar77),auVar94);
          auVar86 = vrcp14ps_avx512vl(auVar89);
          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar184 = ZEXT3264(auVar87);
          auVar88 = vfnmadd213ps_avx512vl(auVar86,auVar89,auVar87);
          auVar78 = vfmadd132ps_fma(auVar88,auVar86,auVar86);
          auVar43._4_4_ = auVar76._4_4_ * auVar104._4_4_;
          auVar43._0_4_ = auVar76._0_4_ * auVar104._0_4_;
          auVar43._8_4_ = auVar76._8_4_ * auVar104._8_4_;
          auVar43._12_4_ = auVar76._12_4_ * auVar104._12_4_;
          auVar43._16_4_ = fVar131 * 0.0;
          auVar43._20_4_ = fVar147 * 0.0;
          auVar43._24_4_ = fVar139 * 0.0;
          auVar43._28_4_ = iVar1;
          auVar80 = vfmadd231ps_fma(auVar43,auVar98,ZEXT1632(auVar80));
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar99,ZEXT1632(auVar77));
          fVar147 = auVar78._0_4_;
          fVar131 = auVar78._4_4_;
          fVar139 = auVar78._8_4_;
          fVar140 = auVar78._12_4_;
          local_620 = ZEXT1632(CONCAT412(auVar80._12_4_ * fVar140,
                                         CONCAT48(auVar80._8_4_ * fVar139,
                                                  CONCAT44(auVar80._4_4_ * fVar131,
                                                           auVar80._0_4_ * fVar147))));
          auVar164._4_4_ = uVar132;
          auVar164._0_4_ = uVar132;
          auVar164._8_4_ = uVar132;
          auVar164._12_4_ = uVar132;
          auVar164._16_4_ = uVar132;
          auVar164._20_4_ = uVar132;
          auVar164._24_4_ = uVar132;
          auVar164._28_4_ = uVar132;
          uVar141 = vcmpps_avx512vl(local_620,auVar172,2);
          uVar21 = vcmpps_avx512vl(auVar164,local_620,2);
          bVar73 = (byte)uVar141 & (byte)uVar21 & bVar73;
          auVar185 = ZEXT3264(local_840);
          auVar186 = ZEXT3264(local_860);
          if (bVar73 == 0) {
            uVar67 = 0;
            auVar138 = ZEXT3264(local_880);
          }
          else {
            uVar141 = vcmpps_avx512vl(auVar89,auVar94,4);
            bVar73 = bVar73 & (byte)uVar141;
            auVar138 = ZEXT3264(local_880);
            if (bVar73 != 0) {
              fVar160 = auVar93._0_4_ * fVar147;
              fVar162 = auVar93._4_4_ * fVar131;
              auVar44._4_4_ = fVar162;
              auVar44._0_4_ = fVar160;
              fVar74 = auVar93._8_4_ * fVar139;
              auVar44._8_4_ = fVar74;
              fVar75 = auVar93._12_4_ * fVar140;
              auVar44._12_4_ = fVar75;
              fVar146 = auVar93._16_4_ * 0.0;
              auVar44._16_4_ = fVar146;
              fVar123 = auVar93._20_4_ * 0.0;
              auVar44._20_4_ = fVar123;
              fVar124 = auVar93._24_4_ * 0.0;
              auVar44._24_4_ = fVar124;
              auVar44._28_4_ = auVar89._28_4_;
              auVar86 = vsubps_avx512vl(auVar87,auVar44);
              local_660._0_4_ =
                   (float)((uint)(bVar66 & 1) * (int)fVar160 |
                          (uint)!(bool)(bVar66 & 1) * auVar86._0_4_);
              bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
              local_660._4_4_ = (float)((uint)bVar14 * (int)fVar162 | (uint)!bVar14 * auVar86._4_4_)
              ;
              bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
              local_660._8_4_ = (float)((uint)bVar14 * (int)fVar74 | (uint)!bVar14 * auVar86._8_4_);
              bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
              local_660._12_4_ =
                   (float)((uint)bVar14 * (int)fVar75 | (uint)!bVar14 * auVar86._12_4_);
              bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
              local_660._16_4_ =
                   (float)((uint)bVar14 * (int)fVar146 | (uint)!bVar14 * auVar86._16_4_);
              bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
              local_660._20_4_ =
                   (float)((uint)bVar14 * (int)fVar123 | (uint)!bVar14 * auVar86._20_4_);
              bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
              local_660._24_4_ =
                   (float)((uint)bVar14 * (int)fVar124 | (uint)!bVar14 * auVar86._24_4_);
              bVar14 = SUB81(uVar67 >> 7,0);
              local_660._28_4_ =
                   (float)((uint)bVar14 * auVar89._28_4_ | (uint)!bVar14 * auVar86._28_4_);
              auVar89 = vsubps_avx(ZEXT1632(auVar9),auVar84);
              auVar78 = vfmadd213ps_fma(auVar89,local_660,auVar84);
              uVar3 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar24._4_4_ = uVar3;
              auVar24._0_4_ = uVar3;
              auVar24._8_4_ = uVar3;
              auVar24._12_4_ = uVar3;
              auVar24._16_4_ = uVar3;
              auVar24._20_4_ = uVar3;
              auVar24._24_4_ = uVar3;
              auVar24._28_4_ = uVar3;
              auVar89 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar78._12_4_ + auVar78._12_4_,
                                                           CONCAT48(auVar78._8_4_ + auVar78._8_4_,
                                                                    CONCAT44(auVar78._4_4_ +
                                                                             auVar78._4_4_,
                                                                             auVar78._0_4_ +
                                                                             auVar78._0_4_)))),
                                        auVar24);
              uVar141 = vcmpps_avx512vl(local_620,auVar89,6);
              if (((byte)uVar141 & bVar73) != 0) {
                auVar152._0_4_ = auVar85._0_4_ * fVar147;
                auVar152._4_4_ = auVar85._4_4_ * fVar131;
                auVar152._8_4_ = auVar85._8_4_ * fVar139;
                auVar152._12_4_ = auVar85._12_4_ * fVar140;
                auVar152._16_4_ = auVar85._16_4_ * 0.0;
                auVar152._20_4_ = auVar85._20_4_ * 0.0;
                auVar152._24_4_ = auVar85._24_4_ * 0.0;
                auVar152._28_4_ = 0;
                auVar89 = vsubps_avx512vl(auVar87,auVar152);
                auVar110._0_4_ =
                     (uint)(bVar66 & 1) * (int)auVar152._0_4_ |
                     (uint)!(bool)(bVar66 & 1) * auVar89._0_4_;
                bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
                auVar110._4_4_ = (uint)bVar14 * (int)auVar152._4_4_ | (uint)!bVar14 * auVar89._4_4_;
                bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
                auVar110._8_4_ = (uint)bVar14 * (int)auVar152._8_4_ | (uint)!bVar14 * auVar89._8_4_;
                bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
                auVar110._12_4_ =
                     (uint)bVar14 * (int)auVar152._12_4_ | (uint)!bVar14 * auVar89._12_4_;
                bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
                auVar110._16_4_ =
                     (uint)bVar14 * (int)auVar152._16_4_ | (uint)!bVar14 * auVar89._16_4_;
                bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
                auVar110._20_4_ =
                     (uint)bVar14 * (int)auVar152._20_4_ | (uint)!bVar14 * auVar89._20_4_;
                bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
                auVar110._24_4_ =
                     (uint)bVar14 * (int)auVar152._24_4_ | (uint)!bVar14 * auVar89._24_4_;
                auVar110._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar89._28_4_;
                auVar25._8_4_ = 0x40000000;
                auVar25._0_8_ = 0x4000000040000000;
                auVar25._12_4_ = 0x40000000;
                auVar25._16_4_ = 0x40000000;
                auVar25._20_4_ = 0x40000000;
                auVar25._24_4_ = 0x40000000;
                auVar25._28_4_ = 0x40000000;
                local_640 = vfmsub132ps_avx512vl(auVar110,auVar87,auVar25);
                local_600 = 0;
                local_5e0 = local_890._0_8_;
                uStack_5d8 = local_890._8_8_;
                local_5d0 = local_8a0._0_8_;
                uStack_5c8 = local_8a0._8_8_;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar67 = CONCAT71((int7)((ulong)pGVar12 >> 8),1),
                     pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar147 = 1.0 / auVar169._0_4_;
                    local_5a0[0] = fVar147 * (local_660._0_4_ + 0.0);
                    local_5a0[1] = fVar147 * (local_660._4_4_ + 1.0);
                    local_5a0[2] = fVar147 * (local_660._8_4_ + 2.0);
                    local_5a0[3] = fVar147 * (local_660._12_4_ + 3.0);
                    fStack_590 = fVar147 * (local_660._16_4_ + 4.0);
                    fStack_58c = fVar147 * (local_660._20_4_ + 5.0);
                    fStack_588 = fVar147 * (local_660._24_4_ + 6.0);
                    fStack_584 = local_660._28_4_ + 7.0;
                    local_580 = local_640;
                    local_560 = local_620;
                    uVar68 = 0;
                    local_720 = (ulong)((byte)uVar141 & bVar73);
                    for (uVar67 = local_720; (uVar67 & 1) == 0;
                        uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                      uVar68 = uVar68 + 1;
                    }
                    auVar184 = vpbroadcastd_avx512f();
                    local_500 = vmovdqa64_avx512f(auVar184);
                    auVar184 = vpbroadcastd_avx512f();
                    local_540 = vmovdqa64_avx512f(auVar184);
                    uVar67 = uVar68;
                    local_780 = auVar172;
                    local_5fc = iVar11;
                    local_5f0 = auVar20;
                    do {
                      auVar77 = auVar183._0_16_;
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5a0[uVar68]));
                      local_6a0 = (uint)uVar68;
                      uStack_69c = (undefined4)(uVar68 >> 0x20);
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_580 + uVar68 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_560 + uVar68 * 4)
                      ;
                      local_8f0.context = context->user;
                      fVar140 = local_200._0_4_;
                      fVar131 = 1.0 - fVar140;
                      fVar147 = fVar131 * fVar131 * -3.0;
                      auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 * fVar131)),
                                                ZEXT416((uint)(fVar140 * fVar131)),
                                                ZEXT416(0xc0000000));
                      auVar80 = vfmsub132ss_fma(ZEXT416((uint)(fVar140 * fVar131)),
                                                ZEXT416((uint)(fVar140 * fVar140)),
                                                ZEXT416(0x40000000));
                      fVar131 = auVar78._0_4_ * 3.0;
                      fVar139 = auVar80._0_4_ * 3.0;
                      fVar140 = fVar140 * fVar140 * 3.0;
                      auVar158._0_4_ = fVar140 * (float)local_730._0_4_;
                      auVar158._4_4_ = fVar140 * (float)local_730._4_4_;
                      auVar158._8_4_ = fVar140 * fStack_728;
                      auVar158._12_4_ = fVar140 * fStack_724;
                      auVar133._4_4_ = fVar139;
                      auVar133._0_4_ = fVar139;
                      auVar133._8_4_ = fVar139;
                      auVar133._12_4_ = fVar139;
                      auVar78 = vfmadd132ps_fma(auVar133,auVar158,local_8a0);
                      auVar150._4_4_ = fVar131;
                      auVar150._0_4_ = fVar131;
                      auVar150._8_4_ = fVar131;
                      auVar150._12_4_ = fVar131;
                      auVar78 = vfmadd132ps_fma(auVar150,auVar78,local_890);
                      auVar134._4_4_ = fVar147;
                      auVar134._0_4_ = fVar147;
                      auVar134._8_4_ = fVar147;
                      auVar134._12_4_ = fVar147;
                      auVar78 = vfmadd213ps_fma(auVar134,auVar20,auVar78);
                      auVar184 = vbroadcastss_avx512f(auVar78);
                      auVar121 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar121,ZEXT1664(auVar78));
                      auVar121 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar121,ZEXT1664(auVar78));
                      local_2c0[0] = (RTCHitN)auVar184[0];
                      local_2c0[1] = (RTCHitN)auVar184[1];
                      local_2c0[2] = (RTCHitN)auVar184[2];
                      local_2c0[3] = (RTCHitN)auVar184[3];
                      local_2c0[4] = (RTCHitN)auVar184[4];
                      local_2c0[5] = (RTCHitN)auVar184[5];
                      local_2c0[6] = (RTCHitN)auVar184[6];
                      local_2c0[7] = (RTCHitN)auVar184[7];
                      local_2c0[8] = (RTCHitN)auVar184[8];
                      local_2c0[9] = (RTCHitN)auVar184[9];
                      local_2c0[10] = (RTCHitN)auVar184[10];
                      local_2c0[0xb] = (RTCHitN)auVar184[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar184[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar184[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar184[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar184[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar184[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar184[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar184[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar184[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar184[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar184[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar184[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar184[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar184[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar184[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar184[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar184[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar184[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar184[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar184[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar184[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar184[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar184[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar184[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar184[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar184[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar184[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar184[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar184[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar184[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar184[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar184[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar184[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar184[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar184[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar184[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar184[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar184[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar184[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar184[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar184[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar184[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar184[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar184[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar184[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar184[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar184[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar184[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar184[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar184[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar184[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar184[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar184[0x3f];
                      local_180 = local_540._0_8_;
                      uStack_178 = local_540._8_8_;
                      uStack_170 = local_540._16_8_;
                      uStack_168 = local_540._24_8_;
                      uStack_160 = local_540._32_8_;
                      uStack_158 = local_540._40_8_;
                      uStack_150 = local_540._48_8_;
                      uStack_148 = local_540._56_8_;
                      auVar184 = vmovdqa64_avx512f(local_500);
                      local_140 = vmovdqa64_avx512f(auVar184);
                      vpcmpeqd_avx2(auVar184._0_32_,auVar184._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_8f0.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_8f0.context)->instPrimID[0]));
                      auVar121 = vmovdqa64_avx512f(local_300);
                      local_700 = vmovdqa64_avx512f(auVar121);
                      local_8f0.valid = (int *)local_700;
                      local_8f0.geometryUserPtr = *(void **)(local_800._0_8_ + 0x18);
                      local_8f0.hit = local_2c0;
                      local_8f0.N = 0x10;
                      local_8f0.ray = (RTCRayN *)ray;
                      if (*(code **)(local_800._0_8_ + 0x48) != (code *)0x0) {
                        (**(code **)(local_800._0_8_ + 0x48))(&local_8f0);
                        auVar174 = ZEXT3264(local_780);
                        auVar186 = ZEXT3264(local_860);
                        auVar185 = ZEXT3264(local_840);
                        auVar138 = ZEXT3264(local_880);
                        auVar178 = ZEXT3264(local_8c0);
                        auVar179 = ZEXT3264(local_7e0);
                        auVar182 = ZEXT3264(local_7c0);
                        auVar181 = ZEXT3264(local_7a0);
                        auVar180 = ZEXT3264(local_760);
                        auVar78 = vxorps_avx512vl(auVar77,auVar77);
                        auVar183 = ZEXT1664(auVar78);
                        auVar121 = vmovdqa64_avx512f(local_700);
                      }
                      auVar78 = auVar183._0_16_;
                      uVar141 = vptestmd_avx512f(auVar121,auVar121);
                      if ((short)uVar141 == 0) {
                        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar184 = ZEXT3264(auVar89);
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if (p_Var13 == (RTCFilterFunctionN)0x0) {
                          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar184 = ZEXT3264(auVar89);
                        }
                        else {
                          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar184 = ZEXT3264(auVar89);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_800._0_8_ + 0x3e) & 0x40) != 0)) {
                            (*p_Var13)(&local_8f0);
                            auVar174 = ZEXT3264(local_780);
                            auVar186 = ZEXT3264(local_860);
                            auVar185 = ZEXT3264(local_840);
                            auVar138 = ZEXT3264(local_880);
                            auVar178 = ZEXT3264(local_8c0);
                            auVar179 = ZEXT3264(local_7e0);
                            auVar182 = ZEXT3264(local_7c0);
                            auVar181 = ZEXT3264(local_7a0);
                            auVar180 = ZEXT3264(local_760);
                            auVar78 = vxorps_avx512vl(auVar78,auVar78);
                            auVar183 = ZEXT1664(auVar78);
                            auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar184 = ZEXT3264(auVar89);
                            auVar121 = vmovdqa64_avx512f(local_700);
                          }
                        }
                        uVar68 = vptestmd_avx512f(auVar121,auVar121);
                        auVar121 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar14 = (bool)((byte)uVar68 & 1);
                        auVar122._0_4_ =
                             (uint)bVar14 * auVar121._0_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x200);
                        bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
                        auVar122._4_4_ =
                             (uint)bVar14 * auVar121._4_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x204);
                        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
                        auVar122._8_4_ =
                             (uint)bVar14 * auVar121._8_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x208);
                        bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
                        auVar122._12_4_ =
                             (uint)bVar14 * auVar121._12_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x20c);
                        bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
                        auVar122._16_4_ =
                             (uint)bVar14 * auVar121._16_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x210);
                        bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
                        auVar122._20_4_ =
                             (uint)bVar14 * auVar121._20_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x214);
                        bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
                        auVar122._24_4_ =
                             (uint)bVar14 * auVar121._24_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x218);
                        bVar14 = (bool)((byte)(uVar68 >> 7) & 1);
                        auVar122._28_4_ =
                             (uint)bVar14 * auVar121._28_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x21c);
                        bVar14 = (bool)((byte)(uVar68 >> 8) & 1);
                        auVar122._32_4_ =
                             (uint)bVar14 * auVar121._32_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x220);
                        bVar14 = (bool)((byte)(uVar68 >> 9) & 1);
                        auVar122._36_4_ =
                             (uint)bVar14 * auVar121._36_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x224);
                        bVar14 = (bool)((byte)(uVar68 >> 10) & 1);
                        auVar122._40_4_ =
                             (uint)bVar14 * auVar121._40_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x228);
                        bVar14 = (bool)((byte)(uVar68 >> 0xb) & 1);
                        auVar122._44_4_ =
                             (uint)bVar14 * auVar121._44_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x22c);
                        bVar14 = (bool)((byte)(uVar68 >> 0xc) & 1);
                        auVar122._48_4_ =
                             (uint)bVar14 * auVar121._48_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x230);
                        bVar14 = (bool)((byte)(uVar68 >> 0xd) & 1);
                        auVar122._52_4_ =
                             (uint)bVar14 * auVar121._52_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x234);
                        bVar14 = (bool)((byte)(uVar68 >> 0xe) & 1);
                        auVar122._56_4_ =
                             (uint)bVar14 * auVar121._56_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x238);
                        bVar14 = SUB81(uVar68 >> 0xf,0);
                        auVar122._60_4_ =
                             (uint)bVar14 * auVar121._60_4_ |
                             (uint)!bVar14 * *(int *)(local_8f0.ray + 0x23c);
                        *(undefined1 (*) [64])(local_8f0.ray + 0x200) = auVar122;
                        if ((short)uVar68 != 0) {
                          uVar67 = CONCAT71((int7)(uVar67 >> 8),1);
                          break;
                        }
                      }
                      *(int *)(ray + k * 4 + 0x200) = auVar174._0_4_;
                      uVar67 = 0;
                      uVar68 = 0;
                      local_720 = local_720 ^ 1L << ((ulong)local_6a0 & 0x3f);
                      for (uVar71 = local_720; (uVar71 & 1) == 0;
                          uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                        uVar68 = uVar68 + 1;
                      }
                    } while (local_720 != 0);
                  }
                  goto LAB_01c8dafa;
                }
              }
            }
            uVar67 = 0;
          }
        }
      }
LAB_01c8dafa:
      if (8 < iVar11) {
        local_800 = vpbroadcastd_avx512vl();
        fStack_67c = local_680;
        fStack_678 = local_680;
        fStack_674 = local_680;
        fStack_670 = local_680;
        fStack_66c = local_680;
        fStack_668 = local_680;
        fStack_664 = local_680;
        fStack_718 = 1.0 / (float)local_480._0_4_;
        auVar174 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar174);
        auVar174 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar174);
        lVar72 = 8;
        fStack_714 = fStack_718;
        fStack_710 = fStack_718;
        fStack_70c = fStack_718;
        fStack_708 = fStack_718;
        fStack_704 = fStack_718;
        local_6a0 = uVar132;
        uStack_69c = uVar132;
        uStack_698 = uVar132;
        uStack_694 = uVar132;
        uStack_690 = uVar132;
        uStack_68c = uVar132;
        uStack_688 = uVar132;
        uStack_684 = uVar132;
        local_720._0_4_ = fStack_718;
        local_720._4_4_ = fStack_718;
        do {
          auVar89 = vpbroadcastd_avx512vl();
          auVar91 = vpor_avx2(auVar89,_DAT_01fe9900);
          uVar21 = vpcmpd_avx512vl(auVar91,local_800,1);
          auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 * 4 + lVar22);
          auVar86 = *(undefined1 (*) [32])(lVar22 + 0x21aa768 + lVar72 * 4);
          auVar87 = *(undefined1 (*) [32])(lVar22 + 0x21aabec + lVar72 * 4);
          auVar88 = *(undefined1 (*) [32])(lVar22 + 0x21ab070 + lVar72 * 4);
          local_840 = auVar185._0_32_;
          auVar90 = vmulps_avx512vl(local_840,auVar88);
          local_860 = auVar186._0_32_;
          auVar99 = vmulps_avx512vl(local_860,auVar88);
          auVar45._4_4_ = auVar88._4_4_ * (float)local_3a0._4_4_;
          auVar45._0_4_ = auVar88._0_4_ * (float)local_3a0._0_4_;
          auVar45._8_4_ = auVar88._8_4_ * fStack_398;
          auVar45._12_4_ = auVar88._12_4_ * fStack_394;
          auVar45._16_4_ = auVar88._16_4_ * fStack_390;
          auVar45._20_4_ = auVar88._20_4_ * fStack_38c;
          auVar45._24_4_ = auVar88._24_4_ * fStack_388;
          auVar45._28_4_ = auVar91._28_4_;
          auVar142 = auVar178._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar142);
          local_880 = auVar138._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar99,auVar87,local_880);
          auVar99 = vfmadd231ps_avx512vl(auVar45,auVar87,local_380);
          auVar163 = auVar182._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,auVar163);
          auVar144 = auVar179._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar86,auVar144);
          auVar78 = vfmadd231ps_fma(auVar99,auVar86,local_360);
          local_760 = auVar180._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar91,auVar89,local_760);
          auVar161 = auVar181._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar161);
          auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 * 4 + lVar22);
          auVar90 = *(undefined1 (*) [32])(lVar22 + 0x21acb88 + lVar72 * 4);
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar89,local_340);
          auVar99 = *(undefined1 (*) [32])(lVar22 + 0x21ad00c + lVar72 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar22 + 0x21ad490 + lVar72 * 4);
          auVar92 = vmulps_avx512vl(local_840,auVar98);
          auVar93 = vmulps_avx512vl(local_860,auVar98);
          auVar46._4_4_ = auVar98._4_4_ * (float)local_3a0._4_4_;
          auVar46._0_4_ = auVar98._0_4_ * (float)local_3a0._0_4_;
          auVar46._8_4_ = auVar98._8_4_ * fStack_398;
          auVar46._12_4_ = auVar98._12_4_ * fStack_394;
          auVar46._16_4_ = auVar98._16_4_ * fStack_390;
          auVar46._20_4_ = auVar98._20_4_ * fStack_38c;
          auVar46._24_4_ = auVar98._24_4_ * fStack_388;
          auVar46._28_4_ = uStack_384;
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,auVar142);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,local_880);
          auVar95 = vfmadd231ps_avx512vl(auVar46,auVar99,local_380);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar90,auVar163);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar144);
          auVar80 = vfmadd231ps_fma(auVar95,auVar90,local_360);
          auVar95 = vfmadd231ps_avx512vl(auVar92,auVar91,local_760);
          auVar83 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar161);
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar91,local_340);
          auVar84 = vmaxps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar80));
          auVar92 = vsubps_avx(auVar95,auVar85);
          auVar93 = vsubps_avx(auVar83,auVar94);
          auVar96 = vmulps_avx512vl(auVar94,auVar92);
          auVar97 = vmulps_avx512vl(auVar85,auVar93);
          auVar96 = vsubps_avx512vl(auVar96,auVar97);
          auVar97 = vmulps_avx512vl(auVar93,auVar93);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,auVar92);
          auVar84 = vmulps_avx512vl(auVar84,auVar84);
          auVar84 = vmulps_avx512vl(auVar84,auVar97);
          auVar96 = vmulps_avx512vl(auVar96,auVar96);
          uVar141 = vcmpps_avx512vl(auVar96,auVar84,2);
          bVar73 = (byte)uVar21 & (byte)uVar141;
          if (bVar73 == 0) {
            auVar174 = ZEXT3264(auVar144);
            auVar178 = ZEXT3264(auVar142);
          }
          else {
            auVar98 = vmulps_avx512vl(local_820,auVar98);
            auVar99 = vfmadd213ps_avx512vl(auVar99,local_400,auVar98);
            auVar90 = vfmadd213ps_avx512vl(auVar90,local_3e0,auVar99);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_3c0,auVar90);
            auVar88 = vmulps_avx512vl(local_820,auVar88);
            auVar87 = vfmadd213ps_avx512vl(auVar87,local_400,auVar88);
            auVar86 = vfmadd213ps_avx512vl(auVar86,local_3e0,auVar87);
            auVar90 = vfmadd213ps_avx512vl(auVar89,local_3c0,auVar86);
            auVar89 = *(undefined1 (*) [32])(lVar22 + 0x21ab4f4 + lVar72 * 4);
            auVar86 = *(undefined1 (*) [32])(lVar22 + 0x21ab978 + lVar72 * 4);
            auVar87 = *(undefined1 (*) [32])(lVar22 + 0x21abdfc + lVar72 * 4);
            auVar88 = *(undefined1 (*) [32])(lVar22 + 0x21ac280 + lVar72 * 4);
            auVar99 = vmulps_avx512vl(local_840,auVar88);
            auVar98 = vmulps_avx512vl(local_860,auVar88);
            auVar88 = vmulps_avx512vl(local_820,auVar88);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar87,auVar142);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar87,local_880);
            auVar87 = vfmadd231ps_avx512vl(auVar88,local_400,auVar87);
            auVar88 = vfmadd231ps_avx512vl(auVar99,auVar86,auVar163);
            auVar99 = vfmadd231ps_avx512vl(auVar98,auVar86,auVar144);
            auVar86 = vfmadd231ps_avx512vl(auVar87,local_3e0,auVar86);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar89,local_760);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar89,auVar161);
            auVar98 = vfmadd231ps_avx512vl(auVar86,local_3c0,auVar89);
            auVar89 = *(undefined1 (*) [32])(lVar22 + 0x21ad914 + lVar72 * 4);
            auVar86 = *(undefined1 (*) [32])(lVar22 + 0x21ae21c + lVar72 * 4);
            auVar87 = *(undefined1 (*) [32])(lVar22 + 0x21ae6a0 + lVar72 * 4);
            auVar84 = vmulps_avx512vl(local_840,auVar87);
            auVar96 = vmulps_avx512vl(local_860,auVar87);
            auVar87 = vmulps_avx512vl(local_820,auVar87);
            auVar84 = vfmadd231ps_avx512vl(auVar84,auVar86,auVar142);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar86,local_880);
            auVar87 = vfmadd231ps_avx512vl(auVar87,local_400,auVar86);
            auVar86 = *(undefined1 (*) [32])(lVar22 + 0x21add98 + lVar72 * 4);
            auVar84 = vfmadd231ps_avx512vl(auVar84,auVar86,auVar163);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar86,auVar144);
            auVar86 = vfmadd231ps_avx512vl(auVar87,local_3e0,auVar86);
            auVar87 = vfmadd231ps_avx512vl(auVar84,auVar89,local_760);
            auVar84 = vfmadd231ps_avx512vl(auVar96,auVar89,auVar161);
            auVar86 = vfmadd231ps_avx512vl(auVar86,local_3c0,auVar89);
            auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar88,auVar96);
            vandps_avx512vl(auVar99,auVar96);
            auVar89 = vmaxps_avx(auVar96,auVar96);
            vandps_avx512vl(auVar98,auVar96);
            auVar89 = vmaxps_avx(auVar89,auVar96);
            auVar65._4_4_ = fStack_67c;
            auVar65._0_4_ = local_680;
            auVar65._8_4_ = fStack_678;
            auVar65._12_4_ = fStack_674;
            auVar65._16_4_ = fStack_670;
            auVar65._20_4_ = fStack_66c;
            auVar65._24_4_ = fStack_668;
            auVar65._28_4_ = fStack_664;
            uVar68 = vcmpps_avx512vl(auVar89,auVar65,1);
            bVar14 = (bool)((byte)uVar68 & 1);
            auVar111._0_4_ = (float)((uint)bVar14 * auVar92._0_4_ | (uint)!bVar14 * auVar88._0_4_);
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar14 * auVar92._4_4_ | (uint)!bVar14 * auVar88._4_4_);
            bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar14 * auVar92._8_4_ | (uint)!bVar14 * auVar88._8_4_);
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar14 * auVar92._12_4_ | (uint)!bVar14 * auVar88._12_4_);
            bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar111._16_4_ =
                 (float)((uint)bVar14 * auVar92._16_4_ | (uint)!bVar14 * auVar88._16_4_);
            bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar111._20_4_ =
                 (float)((uint)bVar14 * auVar92._20_4_ | (uint)!bVar14 * auVar88._20_4_);
            bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar111._24_4_ =
                 (float)((uint)bVar14 * auVar92._24_4_ | (uint)!bVar14 * auVar88._24_4_);
            bVar14 = SUB81(uVar68 >> 7,0);
            auVar111._28_4_ = (uint)bVar14 * auVar92._28_4_ | (uint)!bVar14 * auVar88._28_4_;
            bVar14 = (bool)((byte)uVar68 & 1);
            auVar112._0_4_ = (float)((uint)bVar14 * auVar93._0_4_ | (uint)!bVar14 * auVar99._0_4_);
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar99._4_4_);
            bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar99._8_4_);
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar99._12_4_);
            bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar112._16_4_ =
                 (float)((uint)bVar14 * auVar93._16_4_ | (uint)!bVar14 * auVar99._16_4_);
            bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar112._20_4_ =
                 (float)((uint)bVar14 * auVar93._20_4_ | (uint)!bVar14 * auVar99._20_4_);
            bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar112._24_4_ =
                 (float)((uint)bVar14 * auVar93._24_4_ | (uint)!bVar14 * auVar99._24_4_);
            bVar14 = SUB81(uVar68 >> 7,0);
            auVar112._28_4_ = (uint)bVar14 * auVar93._28_4_ | (uint)!bVar14 * auVar99._28_4_;
            vandps_avx512vl(auVar87,auVar96);
            vandps_avx512vl(auVar84,auVar96);
            auVar89 = vmaxps_avx(auVar112,auVar112);
            vandps_avx512vl(auVar86,auVar96);
            auVar89 = vmaxps_avx(auVar89,auVar112);
            uVar68 = vcmpps_avx512vl(auVar89,auVar65,1);
            bVar14 = (bool)((byte)uVar68 & 1);
            auVar113._0_4_ = (uint)bVar14 * auVar92._0_4_ | (uint)!bVar14 * auVar87._0_4_;
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar113._4_4_ = (uint)bVar14 * auVar92._4_4_ | (uint)!bVar14 * auVar87._4_4_;
            bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar113._8_4_ = (uint)bVar14 * auVar92._8_4_ | (uint)!bVar14 * auVar87._8_4_;
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar113._12_4_ = (uint)bVar14 * auVar92._12_4_ | (uint)!bVar14 * auVar87._12_4_;
            bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar113._16_4_ = (uint)bVar14 * auVar92._16_4_ | (uint)!bVar14 * auVar87._16_4_;
            bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar113._20_4_ = (uint)bVar14 * auVar92._20_4_ | (uint)!bVar14 * auVar87._20_4_;
            bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar113._24_4_ = (uint)bVar14 * auVar92._24_4_ | (uint)!bVar14 * auVar87._24_4_;
            bVar14 = SUB81(uVar68 >> 7,0);
            auVar113._28_4_ = (uint)bVar14 * auVar92._28_4_ | (uint)!bVar14 * auVar87._28_4_;
            bVar14 = (bool)((byte)uVar68 & 1);
            auVar114._0_4_ = (float)((uint)bVar14 * auVar93._0_4_ | (uint)!bVar14 * auVar84._0_4_);
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar84._4_4_);
            bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar84._8_4_);
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar84._12_4_);
            bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar114._16_4_ =
                 (float)((uint)bVar14 * auVar93._16_4_ | (uint)!bVar14 * auVar84._16_4_);
            bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar114._20_4_ =
                 (float)((uint)bVar14 * auVar93._20_4_ | (uint)!bVar14 * auVar84._20_4_);
            bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar114._24_4_ =
                 (float)((uint)bVar14 * auVar93._24_4_ | (uint)!bVar14 * auVar84._24_4_);
            bVar14 = SUB81(uVar68 >> 7,0);
            auVar114._28_4_ = (uint)bVar14 * auVar93._28_4_ | (uint)!bVar14 * auVar84._28_4_;
            auVar166._8_4_ = 0x80000000;
            auVar166._0_8_ = 0x8000000080000000;
            auVar166._12_4_ = 0x80000000;
            auVar166._16_4_ = 0x80000000;
            auVar166._20_4_ = 0x80000000;
            auVar166._24_4_ = 0x80000000;
            auVar166._28_4_ = 0x80000000;
            auVar89 = vxorps_avx512vl(auVar113,auVar166);
            auVar84 = auVar183._0_32_;
            auVar86 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar84);
            auVar77 = vfmadd231ps_fma(auVar86,auVar112,auVar112);
            auVar86 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
            auVar177._8_4_ = 0xbf000000;
            auVar177._0_8_ = 0xbf000000bf000000;
            auVar177._12_4_ = 0xbf000000;
            auVar177._16_4_ = 0xbf000000;
            auVar177._20_4_ = 0xbf000000;
            auVar177._24_4_ = 0xbf000000;
            auVar177._28_4_ = 0xbf000000;
            fVar147 = auVar86._0_4_;
            fVar131 = auVar86._4_4_;
            fVar139 = auVar86._8_4_;
            fVar140 = auVar86._12_4_;
            fVar160 = auVar86._16_4_;
            fVar162 = auVar86._20_4_;
            fVar74 = auVar86._24_4_;
            auVar47._4_4_ = fVar131 * fVar131 * fVar131 * auVar77._4_4_ * -0.5;
            auVar47._0_4_ = fVar147 * fVar147 * fVar147 * auVar77._0_4_ * -0.5;
            auVar47._8_4_ = fVar139 * fVar139 * fVar139 * auVar77._8_4_ * -0.5;
            auVar47._12_4_ = fVar140 * fVar140 * fVar140 * auVar77._12_4_ * -0.5;
            auVar47._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
            auVar47._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
            auVar47._24_4_ = fVar74 * fVar74 * fVar74 * -0.0;
            auVar47._28_4_ = auVar112._28_4_;
            auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar86 = vfmadd231ps_avx512vl(auVar47,auVar87,auVar86);
            auVar48._4_4_ = auVar112._4_4_ * auVar86._4_4_;
            auVar48._0_4_ = auVar112._0_4_ * auVar86._0_4_;
            auVar48._8_4_ = auVar112._8_4_ * auVar86._8_4_;
            auVar48._12_4_ = auVar112._12_4_ * auVar86._12_4_;
            auVar48._16_4_ = auVar112._16_4_ * auVar86._16_4_;
            auVar48._20_4_ = auVar112._20_4_ * auVar86._20_4_;
            auVar48._24_4_ = auVar112._24_4_ * auVar86._24_4_;
            auVar48._28_4_ = 0;
            auVar49._4_4_ = auVar86._4_4_ * -auVar111._4_4_;
            auVar49._0_4_ = auVar86._0_4_ * -auVar111._0_4_;
            auVar49._8_4_ = auVar86._8_4_ * -auVar111._8_4_;
            auVar49._12_4_ = auVar86._12_4_ * -auVar111._12_4_;
            auVar49._16_4_ = auVar86._16_4_ * -auVar111._16_4_;
            auVar49._20_4_ = auVar86._20_4_ * -auVar111._20_4_;
            auVar49._24_4_ = auVar86._24_4_ * -auVar111._24_4_;
            auVar49._28_4_ = auVar112._28_4_;
            auVar88 = vmulps_avx512vl(auVar86,auVar84);
            auVar86 = vfmadd213ps_avx512vl(auVar113,auVar113,auVar84);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar114,auVar114);
            auVar99 = vrsqrt14ps_avx512vl(auVar86);
            auVar86 = vmulps_avx512vl(auVar86,auVar177);
            fVar147 = auVar99._0_4_;
            fVar131 = auVar99._4_4_;
            fVar139 = auVar99._8_4_;
            fVar140 = auVar99._12_4_;
            fVar160 = auVar99._16_4_;
            fVar162 = auVar99._20_4_;
            fVar74 = auVar99._24_4_;
            auVar50._4_4_ = fVar131 * fVar131 * fVar131 * auVar86._4_4_;
            auVar50._0_4_ = fVar147 * fVar147 * fVar147 * auVar86._0_4_;
            auVar50._8_4_ = fVar139 * fVar139 * fVar139 * auVar86._8_4_;
            auVar50._12_4_ = fVar140 * fVar140 * fVar140 * auVar86._12_4_;
            auVar50._16_4_ = fVar160 * fVar160 * fVar160 * auVar86._16_4_;
            auVar50._20_4_ = fVar162 * fVar162 * fVar162 * auVar86._20_4_;
            auVar50._24_4_ = fVar74 * fVar74 * fVar74 * auVar86._24_4_;
            auVar50._28_4_ = auVar86._28_4_;
            auVar86 = vfmadd231ps_avx512vl(auVar50,auVar87,auVar99);
            auVar51._4_4_ = auVar114._4_4_ * auVar86._4_4_;
            auVar51._0_4_ = auVar114._0_4_ * auVar86._0_4_;
            auVar51._8_4_ = auVar114._8_4_ * auVar86._8_4_;
            auVar51._12_4_ = auVar114._12_4_ * auVar86._12_4_;
            auVar51._16_4_ = auVar114._16_4_ * auVar86._16_4_;
            auVar51._20_4_ = auVar114._20_4_ * auVar86._20_4_;
            auVar51._24_4_ = auVar114._24_4_ * auVar86._24_4_;
            auVar51._28_4_ = auVar99._28_4_;
            auVar52._4_4_ = auVar86._4_4_ * auVar89._4_4_;
            auVar52._0_4_ = auVar86._0_4_ * auVar89._0_4_;
            auVar52._8_4_ = auVar86._8_4_ * auVar89._8_4_;
            auVar52._12_4_ = auVar86._12_4_ * auVar89._12_4_;
            auVar52._16_4_ = auVar86._16_4_ * auVar89._16_4_;
            auVar52._20_4_ = auVar86._20_4_ * auVar89._20_4_;
            auVar52._24_4_ = auVar86._24_4_ * auVar89._24_4_;
            auVar52._28_4_ = auVar89._28_4_;
            auVar89 = vmulps_avx512vl(auVar86,auVar84);
            auVar77 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar78),auVar85);
            auVar86 = ZEXT1632(auVar78);
            auVar76 = vfmadd213ps_fma(auVar49,auVar86,auVar94);
            auVar87 = vfmadd213ps_avx512vl(auVar88,auVar86,auVar90);
            auVar99 = vfmadd213ps_avx512vl(auVar51,ZEXT1632(auVar80),auVar95);
            auVar79 = vfnmadd213ps_fma(auVar48,auVar86,auVar85);
            auVar98 = ZEXT1632(auVar80);
            auVar6 = vfmadd213ps_fma(auVar52,auVar98,auVar83);
            auVar81 = vfnmadd213ps_fma(auVar49,auVar86,auVar94);
            auVar7 = vfmadd213ps_fma(auVar89,auVar98,auVar91);
            auVar94 = ZEXT1632(auVar78);
            auVar82 = vfnmadd231ps_fma(auVar90,auVar94,auVar88);
            auVar148 = vfnmadd213ps_fma(auVar51,auVar98,auVar95);
            auVar149 = vfnmadd213ps_fma(auVar52,auVar98,auVar83);
            auVar165 = vfnmadd231ps_fma(auVar91,ZEXT1632(auVar80),auVar89);
            auVar91 = vsubps_avx512vl(auVar99,ZEXT1632(auVar79));
            auVar89 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar81));
            auVar86 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar82));
            auVar53._4_4_ = auVar89._4_4_ * auVar82._4_4_;
            auVar53._0_4_ = auVar89._0_4_ * auVar82._0_4_;
            auVar53._8_4_ = auVar89._8_4_ * auVar82._8_4_;
            auVar53._12_4_ = auVar89._12_4_ * auVar82._12_4_;
            auVar53._16_4_ = auVar89._16_4_ * 0.0;
            auVar53._20_4_ = auVar89._20_4_ * 0.0;
            auVar53._24_4_ = auVar89._24_4_ * 0.0;
            auVar53._28_4_ = auVar88._28_4_;
            auVar78 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar81),auVar86);
            auVar54._4_4_ = auVar86._4_4_ * auVar79._4_4_;
            auVar54._0_4_ = auVar86._0_4_ * auVar79._0_4_;
            auVar54._8_4_ = auVar86._8_4_ * auVar79._8_4_;
            auVar54._12_4_ = auVar86._12_4_ * auVar79._12_4_;
            auVar54._16_4_ = auVar86._16_4_ * 0.0;
            auVar54._20_4_ = auVar86._20_4_ * 0.0;
            auVar54._24_4_ = auVar86._24_4_ * 0.0;
            auVar54._28_4_ = auVar86._28_4_;
            auVar8 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar82),auVar91);
            auVar55._4_4_ = auVar81._4_4_ * auVar91._4_4_;
            auVar55._0_4_ = auVar81._0_4_ * auVar91._0_4_;
            auVar55._8_4_ = auVar81._8_4_ * auVar91._8_4_;
            auVar55._12_4_ = auVar81._12_4_ * auVar91._12_4_;
            auVar55._16_4_ = auVar91._16_4_ * 0.0;
            auVar55._20_4_ = auVar91._20_4_ * 0.0;
            auVar55._24_4_ = auVar91._24_4_ * 0.0;
            auVar55._28_4_ = auVar91._28_4_;
            auVar9 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar79),auVar89);
            auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar84,ZEXT1632(auVar8));
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar84,ZEXT1632(auVar78));
            uVar68 = vcmpps_avx512vl(auVar89,auVar84,2);
            bVar66 = (byte)uVar68;
            fVar123 = (float)((uint)(bVar66 & 1) * auVar77._0_4_ |
                             (uint)!(bool)(bVar66 & 1) * auVar148._0_4_);
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            fVar125 = (float)((uint)bVar14 * auVar77._4_4_ | (uint)!bVar14 * auVar148._4_4_);
            bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
            fVar128 = (float)((uint)bVar14 * auVar77._8_4_ | (uint)!bVar14 * auVar148._8_4_);
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            fVar129 = (float)((uint)bVar14 * auVar77._12_4_ | (uint)!bVar14 * auVar148._12_4_);
            auVar98 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar128,CONCAT44(fVar125,fVar123))));
            fVar124 = (float)((uint)(bVar66 & 1) * auVar76._0_4_ |
                             (uint)!(bool)(bVar66 & 1) * auVar149._0_4_);
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            fVar127 = (float)((uint)bVar14 * auVar76._4_4_ | (uint)!bVar14 * auVar149._4_4_);
            bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
            fVar126 = (float)((uint)bVar14 * auVar76._8_4_ | (uint)!bVar14 * auVar149._8_4_);
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            fVar130 = (float)((uint)bVar14 * auVar76._12_4_ | (uint)!bVar14 * auVar149._12_4_);
            auVar92 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar126,CONCAT44(fVar127,fVar124))));
            auVar115._0_4_ =
                 (float)((uint)(bVar66 & 1) * auVar87._0_4_ |
                        (uint)!(bool)(bVar66 & 1) * auVar165._0_4_);
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar14 * auVar87._4_4_ | (uint)!bVar14 * auVar165._4_4_);
            bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar14 * auVar87._8_4_ | (uint)!bVar14 * auVar165._8_4_);
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar14 * auVar87._12_4_ | (uint)!bVar14 * auVar165._12_4_);
            fVar147 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar87._16_4_);
            auVar115._16_4_ = fVar147;
            fVar131 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar87._20_4_);
            auVar115._20_4_ = fVar131;
            fVar139 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar87._24_4_);
            auVar115._24_4_ = fVar139;
            iVar1 = (uint)(byte)(uVar68 >> 7) * auVar87._28_4_;
            auVar115._28_4_ = iVar1;
            auVar89 = vblendmps_avx512vl(ZEXT1632(auVar79),auVar99);
            auVar116._0_4_ =
                 (uint)(bVar66 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar78._0_4_;
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar116._4_4_ = (uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * auVar78._4_4_;
            bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar116._8_4_ = (uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * auVar78._8_4_;
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar116._12_4_ = (uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * auVar78._12_4_;
            auVar116._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * auVar89._16_4_;
            auVar116._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * auVar89._20_4_;
            auVar116._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * auVar89._24_4_;
            auVar116._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar89._28_4_;
            auVar89 = vblendmps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar6));
            auVar117._0_4_ =
                 (float)((uint)(bVar66 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar66 & 1) * auVar77._0_4_);
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * auVar77._4_4_);
            bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * auVar77._8_4_);
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * auVar77._12_4_);
            fVar140 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar89._16_4_);
            auVar117._16_4_ = fVar140;
            fVar160 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar89._20_4_);
            auVar117._20_4_ = fVar160;
            fVar162 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar89._24_4_);
            auVar117._24_4_ = fVar162;
            auVar117._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar89._28_4_;
            auVar89 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar7));
            auVar118._0_4_ =
                 (float)((uint)(bVar66 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar66 & 1) * auVar76._0_4_);
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * auVar76._4_4_);
            bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * auVar76._8_4_);
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * auVar76._12_4_);
            fVar74 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar89._16_4_);
            auVar118._16_4_ = fVar74;
            fVar75 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar89._20_4_);
            auVar118._20_4_ = fVar75;
            fVar146 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar89._24_4_);
            auVar118._24_4_ = fVar146;
            iVar2 = (uint)(byte)(uVar68 >> 7) * auVar89._28_4_;
            auVar118._28_4_ = iVar2;
            auVar119._0_4_ =
                 (uint)(bVar66 & 1) * (int)auVar79._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar99._0_4_
            ;
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar119._4_4_ = (uint)bVar14 * (int)auVar79._4_4_ | (uint)!bVar14 * auVar99._4_4_;
            bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar119._8_4_ = (uint)bVar14 * (int)auVar79._8_4_ | (uint)!bVar14 * auVar99._8_4_;
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar119._12_4_ = (uint)bVar14 * (int)auVar79._12_4_ | (uint)!bVar14 * auVar99._12_4_;
            auVar119._16_4_ = (uint)!(bool)((byte)(uVar68 >> 4) & 1) * auVar99._16_4_;
            auVar119._20_4_ = (uint)!(bool)((byte)(uVar68 >> 5) & 1) * auVar99._20_4_;
            auVar119._24_4_ = (uint)!(bool)((byte)(uVar68 >> 6) & 1) * auVar99._24_4_;
            auVar119._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar99._28_4_;
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar68 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar68 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar68 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar99 = vsubps_avx512vl(auVar119,auVar98);
            auVar86 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar81._12_4_ |
                                                    (uint)!bVar18 * auVar6._12_4_,
                                                    CONCAT48((uint)bVar16 * (int)auVar81._8_4_ |
                                                             (uint)!bVar16 * auVar6._8_4_,
                                                             CONCAT44((uint)bVar14 *
                                                                      (int)auVar81._4_4_ |
                                                                      (uint)!bVar14 * auVar6._4_4_,
                                                                      (uint)(bVar66 & 1) *
                                                                      (int)auVar81._0_4_ |
                                                                      (uint)!(bool)(bVar66 & 1) *
                                                                      auVar6._0_4_)))),auVar92);
            auVar87 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar82._12_4_ |
                                                    (uint)!bVar19 * auVar7._12_4_,
                                                    CONCAT48((uint)bVar17 * (int)auVar82._8_4_ |
                                                             (uint)!bVar17 * auVar7._8_4_,
                                                             CONCAT44((uint)bVar15 *
                                                                      (int)auVar82._4_4_ |
                                                                      (uint)!bVar15 * auVar7._4_4_,
                                                                      (uint)(bVar66 & 1) *
                                                                      (int)auVar82._0_4_ |
                                                                      (uint)!(bool)(bVar66 & 1) *
                                                                      auVar7._0_4_)))),auVar115);
            auVar88 = vsubps_avx(auVar98,auVar116);
            auVar91 = vsubps_avx(auVar92,auVar117);
            auVar90 = vsubps_avx(auVar115,auVar118);
            auVar56._4_4_ = auVar87._4_4_ * fVar125;
            auVar56._0_4_ = auVar87._0_4_ * fVar123;
            auVar56._8_4_ = auVar87._8_4_ * fVar128;
            auVar56._12_4_ = auVar87._12_4_ * fVar129;
            auVar56._16_4_ = auVar87._16_4_ * 0.0;
            auVar56._20_4_ = auVar87._20_4_ * 0.0;
            auVar56._24_4_ = auVar87._24_4_ * 0.0;
            auVar56._28_4_ = 0;
            auVar78 = vfmsub231ps_fma(auVar56,auVar115,auVar99);
            auVar153._0_4_ = fVar124 * auVar99._0_4_;
            auVar153._4_4_ = fVar127 * auVar99._4_4_;
            auVar153._8_4_ = fVar126 * auVar99._8_4_;
            auVar153._12_4_ = fVar130 * auVar99._12_4_;
            auVar153._16_4_ = auVar99._16_4_ * 0.0;
            auVar153._20_4_ = auVar99._20_4_ * 0.0;
            auVar153._24_4_ = auVar99._24_4_ * 0.0;
            auVar153._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar153,auVar98,auVar86);
            auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar84,ZEXT1632(auVar78));
            auVar156._0_4_ = auVar86._0_4_ * auVar115._0_4_;
            auVar156._4_4_ = auVar86._4_4_ * auVar115._4_4_;
            auVar156._8_4_ = auVar86._8_4_ * auVar115._8_4_;
            auVar156._12_4_ = auVar86._12_4_ * auVar115._12_4_;
            auVar156._16_4_ = auVar86._16_4_ * fVar147;
            auVar156._20_4_ = auVar86._20_4_ * fVar131;
            auVar156._24_4_ = auVar86._24_4_ * fVar139;
            auVar156._28_4_ = 0;
            auVar78 = vfmsub231ps_fma(auVar156,auVar92,auVar87);
            auVar93 = vfmadd231ps_avx512vl(auVar89,auVar84,ZEXT1632(auVar78));
            auVar89 = vmulps_avx512vl(auVar90,auVar116);
            auVar89 = vfmsub231ps_avx512vl(auVar89,auVar88,auVar118);
            auVar57._4_4_ = auVar91._4_4_ * auVar118._4_4_;
            auVar57._0_4_ = auVar91._0_4_ * auVar118._0_4_;
            auVar57._8_4_ = auVar91._8_4_ * auVar118._8_4_;
            auVar57._12_4_ = auVar91._12_4_ * auVar118._12_4_;
            auVar57._16_4_ = auVar91._16_4_ * fVar74;
            auVar57._20_4_ = auVar91._20_4_ * fVar75;
            auVar57._24_4_ = auVar91._24_4_ * fVar146;
            auVar57._28_4_ = iVar2;
            auVar78 = vfmsub231ps_fma(auVar57,auVar117,auVar90);
            auVar157._0_4_ = auVar117._0_4_ * auVar88._0_4_;
            auVar157._4_4_ = auVar117._4_4_ * auVar88._4_4_;
            auVar157._8_4_ = auVar117._8_4_ * auVar88._8_4_;
            auVar157._12_4_ = auVar117._12_4_ * auVar88._12_4_;
            auVar157._16_4_ = fVar140 * auVar88._16_4_;
            auVar157._20_4_ = fVar160 * auVar88._20_4_;
            auVar157._24_4_ = fVar162 * auVar88._24_4_;
            auVar157._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar157,auVar91,auVar116);
            auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar84,auVar89);
            auVar85 = vfmadd231ps_avx512vl(auVar89,auVar84,ZEXT1632(auVar78));
            auVar89 = vmaxps_avx(auVar93,auVar85);
            uVar141 = vcmpps_avx512vl(auVar89,auVar84,2);
            bVar73 = bVar73 & (byte)uVar141;
            auVar174 = ZEXT3264(auVar144);
            if (bVar73 != 0) {
              uVar132 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar173._4_4_ = uVar132;
              auVar173._0_4_ = uVar132;
              auVar173._8_4_ = uVar132;
              auVar173._12_4_ = uVar132;
              auVar173._16_4_ = uVar132;
              auVar173._20_4_ = uVar132;
              auVar173._24_4_ = uVar132;
              auVar173._28_4_ = uVar132;
              auVar121 = ZEXT3264(auVar173);
              auVar58._4_4_ = auVar90._4_4_ * auVar86._4_4_;
              auVar58._0_4_ = auVar90._0_4_ * auVar86._0_4_;
              auVar58._8_4_ = auVar90._8_4_ * auVar86._8_4_;
              auVar58._12_4_ = auVar90._12_4_ * auVar86._12_4_;
              auVar58._16_4_ = auVar90._16_4_ * auVar86._16_4_;
              auVar58._20_4_ = auVar90._20_4_ * auVar86._20_4_;
              auVar58._24_4_ = auVar90._24_4_ * auVar86._24_4_;
              auVar58._28_4_ = auVar89._28_4_;
              auVar76 = vfmsub231ps_fma(auVar58,auVar91,auVar87);
              auVar59._4_4_ = auVar87._4_4_ * auVar88._4_4_;
              auVar59._0_4_ = auVar87._0_4_ * auVar88._0_4_;
              auVar59._8_4_ = auVar87._8_4_ * auVar88._8_4_;
              auVar59._12_4_ = auVar87._12_4_ * auVar88._12_4_;
              auVar59._16_4_ = auVar87._16_4_ * auVar88._16_4_;
              auVar59._20_4_ = auVar87._20_4_ * auVar88._20_4_;
              auVar59._24_4_ = auVar87._24_4_ * auVar88._24_4_;
              auVar59._28_4_ = auVar87._28_4_;
              auVar77 = vfmsub231ps_fma(auVar59,auVar99,auVar90);
              auVar60._4_4_ = auVar91._4_4_ * auVar99._4_4_;
              auVar60._0_4_ = auVar91._0_4_ * auVar99._0_4_;
              auVar60._8_4_ = auVar91._8_4_ * auVar99._8_4_;
              auVar60._12_4_ = auVar91._12_4_ * auVar99._12_4_;
              auVar60._16_4_ = auVar91._16_4_ * auVar99._16_4_;
              auVar60._20_4_ = auVar91._20_4_ * auVar99._20_4_;
              auVar60._24_4_ = auVar91._24_4_ * auVar99._24_4_;
              auVar60._28_4_ = auVar91._28_4_;
              auVar6 = vfmsub231ps_fma(auVar60,auVar88,auVar86);
              auVar78 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar77),ZEXT1632(auVar6));
              auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar76),auVar84);
              auVar86 = vrcp14ps_avx512vl(auVar89);
              auVar88 = auVar184._0_32_;
              auVar87 = vfnmadd213ps_avx512vl(auVar86,auVar89,auVar88);
              auVar78 = vfmadd132ps_fma(auVar87,auVar86,auVar86);
              auVar61._4_4_ = auVar6._4_4_ * auVar115._4_4_;
              auVar61._0_4_ = auVar6._0_4_ * auVar115._0_4_;
              auVar61._8_4_ = auVar6._8_4_ * auVar115._8_4_;
              auVar61._12_4_ = auVar6._12_4_ * auVar115._12_4_;
              auVar61._16_4_ = fVar147 * 0.0;
              auVar61._20_4_ = fVar131 * 0.0;
              auVar61._24_4_ = fVar139 * 0.0;
              auVar61._28_4_ = iVar1;
              auVar77 = vfmadd231ps_fma(auVar61,auVar92,ZEXT1632(auVar77));
              auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar98,ZEXT1632(auVar76));
              fVar147 = auVar78._0_4_;
              fVar131 = auVar78._4_4_;
              fVar139 = auVar78._8_4_;
              fVar140 = auVar78._12_4_;
              local_620 = ZEXT1632(CONCAT412(auVar77._12_4_ * fVar140,
                                             CONCAT48(auVar77._8_4_ * fVar139,
                                                      CONCAT44(auVar77._4_4_ * fVar131,
                                                               auVar77._0_4_ * fVar147))));
              uVar141 = vcmpps_avx512vl(local_620,auVar173,2);
              auVar64._4_4_ = uStack_69c;
              auVar64._0_4_ = local_6a0;
              auVar64._8_4_ = uStack_698;
              auVar64._12_4_ = uStack_694;
              auVar64._16_4_ = uStack_690;
              auVar64._20_4_ = uStack_68c;
              auVar64._24_4_ = uStack_688;
              auVar64._28_4_ = uStack_684;
              uVar21 = vcmpps_avx512vl(local_620,auVar64,0xd);
              bVar73 = (byte)uVar141 & (byte)uVar21 & bVar73;
              if (bVar73 != 0) {
                uVar141 = vcmpps_avx512vl(auVar89,auVar84,4);
                bVar73 = bVar73 & (byte)uVar141;
                auVar178 = ZEXT3264(local_8c0);
                if (bVar73 != 0) {
                  fVar160 = auVar93._0_4_ * fVar147;
                  fVar162 = auVar93._4_4_ * fVar131;
                  auVar62._4_4_ = fVar162;
                  auVar62._0_4_ = fVar160;
                  fVar74 = auVar93._8_4_ * fVar139;
                  auVar62._8_4_ = fVar74;
                  fVar75 = auVar93._12_4_ * fVar140;
                  auVar62._12_4_ = fVar75;
                  fVar146 = auVar93._16_4_ * 0.0;
                  auVar62._16_4_ = fVar146;
                  fVar123 = auVar93._20_4_ * 0.0;
                  auVar62._20_4_ = fVar123;
                  fVar124 = auVar93._24_4_ * 0.0;
                  auVar62._24_4_ = fVar124;
                  auVar62._28_4_ = auVar89._28_4_;
                  auVar86 = vsubps_avx512vl(auVar88,auVar62);
                  local_660._0_4_ =
                       (float)((uint)(bVar66 & 1) * (int)fVar160 |
                              (uint)!(bool)(bVar66 & 1) * auVar86._0_4_);
                  bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
                  local_660._4_4_ =
                       (float)((uint)bVar14 * (int)fVar162 | (uint)!bVar14 * auVar86._4_4_);
                  bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
                  local_660._8_4_ =
                       (float)((uint)bVar14 * (int)fVar74 | (uint)!bVar14 * auVar86._8_4_);
                  bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
                  local_660._12_4_ =
                       (float)((uint)bVar14 * (int)fVar75 | (uint)!bVar14 * auVar86._12_4_);
                  bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
                  local_660._16_4_ =
                       (float)((uint)bVar14 * (int)fVar146 | (uint)!bVar14 * auVar86._16_4_);
                  bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
                  local_660._20_4_ =
                       (float)((uint)bVar14 * (int)fVar123 | (uint)!bVar14 * auVar86._20_4_);
                  bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
                  local_660._24_4_ =
                       (float)((uint)bVar14 * (int)fVar124 | (uint)!bVar14 * auVar86._24_4_);
                  bVar14 = SUB81(uVar68 >> 7,0);
                  local_660._28_4_ =
                       (float)((uint)bVar14 * auVar89._28_4_ | (uint)!bVar14 * auVar86._28_4_);
                  auVar89 = vsubps_avx(ZEXT1632(auVar80),auVar94);
                  auVar78 = vfmadd213ps_fma(auVar89,local_660,auVar94);
                  uVar132 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                  auVar27._4_4_ = uVar132;
                  auVar27._0_4_ = uVar132;
                  auVar27._8_4_ = uVar132;
                  auVar27._12_4_ = uVar132;
                  auVar27._16_4_ = uVar132;
                  auVar27._20_4_ = uVar132;
                  auVar27._24_4_ = uVar132;
                  auVar27._28_4_ = uVar132;
                  auVar89 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar78._12_4_ + auVar78._12_4_,
                                                               CONCAT48(auVar78._8_4_ +
                                                                        auVar78._8_4_,
                                                                        CONCAT44(auVar78._4_4_ +
                                                                                 auVar78._4_4_,
                                                                                 auVar78._0_4_ +
                                                                                 auVar78._0_4_)))),
                                            auVar27);
                  uVar141 = vcmpps_avx512vl(local_620,auVar89,6);
                  if (((byte)uVar141 & bVar73) != 0) {
                    auVar143._0_4_ = auVar85._0_4_ * fVar147;
                    auVar143._4_4_ = auVar85._4_4_ * fVar131;
                    auVar143._8_4_ = auVar85._8_4_ * fVar139;
                    auVar143._12_4_ = auVar85._12_4_ * fVar140;
                    auVar143._16_4_ = auVar85._16_4_ * 0.0;
                    auVar143._20_4_ = auVar85._20_4_ * 0.0;
                    auVar143._24_4_ = auVar85._24_4_ * 0.0;
                    auVar143._28_4_ = 0;
                    auVar89 = vsubps_avx512vl(auVar88,auVar143);
                    auVar120._0_4_ =
                         (uint)(bVar66 & 1) * (int)auVar143._0_4_ |
                         (uint)!(bool)(bVar66 & 1) * auVar89._0_4_;
                    bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
                    auVar120._4_4_ =
                         (uint)bVar14 * (int)auVar143._4_4_ | (uint)!bVar14 * auVar89._4_4_;
                    bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
                    auVar120._8_4_ =
                         (uint)bVar14 * (int)auVar143._8_4_ | (uint)!bVar14 * auVar89._8_4_;
                    bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
                    auVar120._12_4_ =
                         (uint)bVar14 * (int)auVar143._12_4_ | (uint)!bVar14 * auVar89._12_4_;
                    bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
                    auVar120._16_4_ =
                         (uint)bVar14 * (int)auVar143._16_4_ | (uint)!bVar14 * auVar89._16_4_;
                    bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
                    auVar120._20_4_ =
                         (uint)bVar14 * (int)auVar143._20_4_ | (uint)!bVar14 * auVar89._20_4_;
                    bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
                    auVar120._24_4_ =
                         (uint)bVar14 * (int)auVar143._24_4_ | (uint)!bVar14 * auVar89._24_4_;
                    auVar120._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar89._28_4_;
                    auVar28._8_4_ = 0x40000000;
                    auVar28._0_8_ = 0x4000000040000000;
                    auVar28._12_4_ = 0x40000000;
                    auVar28._16_4_ = 0x40000000;
                    auVar28._20_4_ = 0x40000000;
                    auVar28._24_4_ = 0x40000000;
                    auVar28._28_4_ = 0x40000000;
                    local_640 = vfmsub132ps_avx512vl(auVar120,auVar88,auVar28);
                    local_600 = (undefined4)lVar72;
                    local_5e0 = local_890._0_8_;
                    uStack_5d8 = local_890._8_8_;
                    local_5d0 = local_8a0._0_8_;
                    uStack_5c8 = local_8a0._8_8_;
                    pGVar12 = (context->scene->geometries).items[uVar69].ptr;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                      bVar66 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar66 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar78 = vcvtsi2ss_avx512f(auVar179._0_16_,local_600);
                      fVar147 = auVar78._0_4_;
                      local_5a0[0] = (fVar147 + local_660._0_4_ + 0.0) * (float)local_720;
                      local_5a0[1] = (fVar147 + local_660._4_4_ + 1.0) * local_720._4_4_;
                      local_5a0[2] = (fVar147 + local_660._8_4_ + 2.0) * fStack_718;
                      local_5a0[3] = (fVar147 + local_660._12_4_ + 3.0) * fStack_714;
                      fStack_590 = (fVar147 + local_660._16_4_ + 4.0) * fStack_710;
                      fStack_58c = (fVar147 + local_660._20_4_ + 5.0) * fStack_70c;
                      fStack_588 = (fVar147 + local_660._24_4_ + 6.0) * fStack_708;
                      fStack_584 = fVar147 + local_660._28_4_ + 7.0;
                      local_580 = local_640;
                      local_560 = local_620;
                      uVar68 = CONCAT71(0,(byte)uVar141 & bVar73);
                      local_540._0_8_ = uVar68;
                      lVar23 = 0;
                      for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                        lVar23 = lVar23 + 1;
                      }
                      local_500._0_8_ = lVar23;
                      local_780._0_4_ = (int)uVar67;
                      local_4a0 = auVar173;
                      local_5fc = iVar11;
                      local_5f0 = auVar20;
                      do {
                        auVar77 = auVar183._0_16_;
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5a0[local_500._0_8_]));
                        local_1c0 = vbroadcastss_avx512f
                                              (ZEXT416(*(uint *)(local_580 + local_500._0_8_ * 4)));
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_560 + local_500._0_8_ * 4);
                        local_8f0.context = context->user;
                        fVar140 = local_200._0_4_;
                        fVar131 = 1.0 - fVar140;
                        fVar147 = fVar131 * fVar131 * -3.0;
                        auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 * fVar131)),
                                                  ZEXT416((uint)(fVar140 * fVar131)),
                                                  ZEXT416(0xc0000000));
                        auVar80 = vfmsub132ss_fma(ZEXT416((uint)(fVar140 * fVar131)),
                                                  ZEXT416((uint)(fVar140 * fVar140)),
                                                  ZEXT416(0x40000000));
                        fVar131 = auVar78._0_4_ * 3.0;
                        fVar139 = auVar80._0_4_ * 3.0;
                        fVar140 = fVar140 * fVar140 * 3.0;
                        auVar159._0_4_ = fVar140 * (float)local_730._0_4_;
                        auVar159._4_4_ = fVar140 * (float)local_730._4_4_;
                        auVar159._8_4_ = fVar140 * fStack_728;
                        auVar159._12_4_ = fVar140 * fStack_724;
                        auVar135._4_4_ = fVar139;
                        auVar135._0_4_ = fVar139;
                        auVar135._8_4_ = fVar139;
                        auVar135._12_4_ = fVar139;
                        auVar78 = vfmadd132ps_fma(auVar135,auVar159,local_8a0);
                        auVar151._4_4_ = fVar131;
                        auVar151._0_4_ = fVar131;
                        auVar151._8_4_ = fVar131;
                        auVar151._12_4_ = fVar131;
                        auVar78 = vfmadd132ps_fma(auVar151,auVar78,local_890);
                        auVar136._4_4_ = fVar147;
                        auVar136._0_4_ = fVar147;
                        auVar136._8_4_ = fVar147;
                        auVar136._12_4_ = fVar147;
                        auVar78 = vfmadd213ps_fma(auVar136,auVar20,auVar78);
                        auVar138 = vbroadcastss_avx512f(auVar78);
                        auVar185 = vbroadcastss_avx512f(ZEXT416(1));
                        local_280 = vpermps_avx512f(auVar185,ZEXT1664(auVar78));
                        auVar185 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar185,ZEXT1664(auVar78));
                        local_2c0[0] = (RTCHitN)auVar138[0];
                        local_2c0[1] = (RTCHitN)auVar138[1];
                        local_2c0[2] = (RTCHitN)auVar138[2];
                        local_2c0[3] = (RTCHitN)auVar138[3];
                        local_2c0[4] = (RTCHitN)auVar138[4];
                        local_2c0[5] = (RTCHitN)auVar138[5];
                        local_2c0[6] = (RTCHitN)auVar138[6];
                        local_2c0[7] = (RTCHitN)auVar138[7];
                        local_2c0[8] = (RTCHitN)auVar138[8];
                        local_2c0[9] = (RTCHitN)auVar138[9];
                        local_2c0[10] = (RTCHitN)auVar138[10];
                        local_2c0[0xb] = (RTCHitN)auVar138[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar138[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar138[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar138[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar138[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar138[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar138[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar138[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar138[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar138[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar138[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar138[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar138[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar138[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar138[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar138[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar138[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar138[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar138[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar138[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar138[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar138[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar138[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar138[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar138[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar138[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar138[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar138[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar138[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar138[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar138[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar138[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar138[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar138[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar138[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar138[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar138[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar138[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar138[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar138[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar138[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar138[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar138[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar138[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar138[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar138[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar138[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar138[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar138[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar138[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar138[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar138[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar138[0x3f];
                        local_180 = local_440._0_8_;
                        uStack_178 = local_440._8_8_;
                        uStack_170 = local_440._16_8_;
                        uStack_168 = local_440._24_8_;
                        uStack_160 = local_440._32_8_;
                        uStack_158 = local_440._40_8_;
                        uStack_150 = local_440._48_8_;
                        uStack_148 = local_440._56_8_;
                        auVar138 = vmovdqa64_avx512f(local_480);
                        local_140 = vmovdqa64_avx512f(auVar138);
                        vpcmpeqd_avx2(auVar138._0_32_,auVar138._0_32_);
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_8f0.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_8f0.context)->instPrimID[0]))
                        ;
                        auVar138 = vmovdqa64_avx512f(local_300);
                        local_700 = vmovdqa64_avx512f(auVar138);
                        local_8f0.valid = (int *)local_700;
                        local_8f0.geometryUserPtr = pGVar12->userPtr;
                        local_8f0.hit = local_2c0;
                        local_8f0.N = 0x10;
                        local_8f0.ray = (RTCRayN *)ray;
                        if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar12->occlusionFilterN)(&local_8f0);
                          auVar121 = ZEXT3264(local_4a0);
                          uVar67 = (ulong)(uint)local_780._0_4_;
                          auVar178 = ZEXT3264(local_8c0);
                          auVar174 = ZEXT3264(local_7e0);
                          auVar182 = ZEXT3264(local_7c0);
                          auVar181 = ZEXT3264(local_7a0);
                          auVar180 = ZEXT3264(local_760);
                          auVar78 = vxorps_avx512vl(auVar77,auVar77);
                          auVar183 = ZEXT1664(auVar78);
                          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar184 = ZEXT3264(auVar89);
                          auVar138 = vmovdqa64_avx512f(local_700);
                        }
                        auVar78 = auVar183._0_16_;
                        uVar141 = vptestmd_avx512f(auVar138,auVar138);
                        if ((short)uVar141 == 0) {
                          auVar138 = ZEXT3264(local_880);
                          auVar185 = ZEXT3264(local_840);
                          auVar186 = ZEXT3264(local_860);
                        }
                        else {
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var13)(&local_8f0);
                            auVar121 = ZEXT3264(local_4a0);
                            uVar67 = (ulong)(uint)local_780._0_4_;
                            auVar178 = ZEXT3264(local_8c0);
                            auVar174 = ZEXT3264(local_7e0);
                            auVar182 = ZEXT3264(local_7c0);
                            auVar181 = ZEXT3264(local_7a0);
                            auVar180 = ZEXT3264(local_760);
                            auVar78 = vxorps_avx512vl(auVar78,auVar78);
                            auVar183 = ZEXT1664(auVar78);
                            auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar184 = ZEXT3264(auVar89);
                            auVar138 = vmovdqa64_avx512f(local_700);
                          }
                          uVar68 = vptestmd_avx512f(auVar138,auVar138);
                          auVar185 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar14 = (bool)((byte)uVar68 & 1);
                          auVar138._0_4_ =
                               (uint)bVar14 * auVar185._0_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x200);
                          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
                          auVar138._4_4_ =
                               (uint)bVar14 * auVar185._4_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x204);
                          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
                          auVar138._8_4_ =
                               (uint)bVar14 * auVar185._8_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x208);
                          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
                          auVar138._12_4_ =
                               (uint)bVar14 * auVar185._12_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x20c);
                          bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
                          auVar138._16_4_ =
                               (uint)bVar14 * auVar185._16_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x210);
                          bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
                          auVar138._20_4_ =
                               (uint)bVar14 * auVar185._20_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x214);
                          bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
                          auVar138._24_4_ =
                               (uint)bVar14 * auVar185._24_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x218);
                          bVar14 = (bool)((byte)(uVar68 >> 7) & 1);
                          auVar138._28_4_ =
                               (uint)bVar14 * auVar185._28_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x21c);
                          bVar14 = (bool)((byte)(uVar68 >> 8) & 1);
                          auVar138._32_4_ =
                               (uint)bVar14 * auVar185._32_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x220);
                          bVar14 = (bool)((byte)(uVar68 >> 9) & 1);
                          auVar138._36_4_ =
                               (uint)bVar14 * auVar185._36_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x224);
                          bVar14 = (bool)((byte)(uVar68 >> 10) & 1);
                          auVar138._40_4_ =
                               (uint)bVar14 * auVar185._40_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x228);
                          bVar14 = (bool)((byte)(uVar68 >> 0xb) & 1);
                          auVar138._44_4_ =
                               (uint)bVar14 * auVar185._44_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x22c);
                          bVar14 = (bool)((byte)(uVar68 >> 0xc) & 1);
                          auVar138._48_4_ =
                               (uint)bVar14 * auVar185._48_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x230);
                          bVar14 = (bool)((byte)(uVar68 >> 0xd) & 1);
                          auVar138._52_4_ =
                               (uint)bVar14 * auVar185._52_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x234);
                          bVar14 = (bool)((byte)(uVar68 >> 0xe) & 1);
                          auVar138._56_4_ =
                               (uint)bVar14 * auVar185._56_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x238);
                          bVar14 = SUB81(uVar68 >> 0xf,0);
                          auVar138._60_4_ =
                               (uint)bVar14 * auVar185._60_4_ |
                               (uint)!bVar14 * *(int *)(local_8f0.ray + 0x23c);
                          *(undefined1 (*) [64])(local_8f0.ray + 0x200) = auVar138;
                          auVar138 = ZEXT3264(local_880);
                          auVar185 = ZEXT3264(local_840);
                          auVar186 = ZEXT3264(local_860);
                          if ((short)uVar68 != 0) {
                            bVar66 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x200) = auVar121._0_4_;
                        local_540._0_8_ = local_540._0_8_ ^ 1L << (local_500._0_8_ & 0x3f);
                        bVar66 = 0;
                        lVar23 = 0;
                        for (uVar68 = local_540._0_8_; (uVar68 & 1) == 0;
                            uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                          lVar23 = lVar23 + 1;
                        }
                        local_500._0_8_ = lVar23;
                      } while (local_540._0_8_ != 0);
                    }
                    uVar67 = CONCAT71((int7)(uVar67 >> 8),(byte)uVar67 | bVar66);
                  }
                }
                goto LAB_01c8e6bd;
              }
            }
            auVar178 = ZEXT3264(local_8c0);
          }
LAB_01c8e6bd:
          lVar72 = lVar72 + 8;
          auVar179 = auVar174;
        } while ((int)lVar72 < iVar11);
      }
      bVar73 = (byte)uVar67;
      if ((uVar67 & 1) != 0) break;
      uVar132 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar26._4_4_ = uVar132;
      auVar26._0_4_ = uVar132;
      auVar26._8_4_ = uVar132;
      auVar26._12_4_ = uVar132;
      auVar26._16_4_ = uVar132;
      auVar26._20_4_ = uVar132;
      auVar26._24_4_ = uVar132;
      auVar26._28_4_ = uVar132;
      uVar141 = vcmpps_avx512vl(local_320,auVar26,2);
      uVar69 = (uint)uVar70 & (uint)uVar141;
      uVar70 = (ulong)uVar69;
    } while (uVar69 != 0);
  }
  return (bool)(bVar73 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }